

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O1

void compact_reopen_named_kvs(void)

{
  uint64_t *puVar1;
  short *psVar2;
  fdb_status fVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  fdb_kvs_handle *pfVar8;
  size_t sVar9;
  uint64_t extraout_RAX;
  uint64_t uVar10;
  fdb_kvs_handle *handle;
  fdb_kvs_handle *pfVar11;
  fdb_kvs_config *config;
  fdb_kvs_info *info;
  fdb_file_info *kvs_config_00;
  void *__s2;
  ulong uVar12;
  size_t sVar13;
  code *__s;
  void *pvVar14;
  fdb_kvs_handle **ppfVar15;
  fdb_kvs_handle *pfVar16;
  char *pcVar17;
  char cVar18;
  char *unaff_RBP;
  fdb_kvs_handle *pfVar19;
  char *pcVar20;
  fdb_file_info *info_00;
  fdb_file_handle *pfVar21;
  fdb_iterator *pfVar22;
  fdb_kvs_handle *ptr_fhandle;
  undefined1 handle_00 [8];
  uint uVar23;
  void *unaff_R12;
  long lVar24;
  bool *pbVar25;
  size_t unaff_R13;
  btree *pbVar26;
  fdb_config *pfVar27;
  ulong uVar28;
  size_t sVar29;
  btree *ptr_fhandle_00;
  fdb_doc **ppfVar30;
  __atomic_base<unsigned_long> _Var31;
  timeval tVar32;
  timeval tVar33;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_kvs_info kvs_info;
  char bodybuf [256];
  fdb_config fconfig;
  char metabuf [256];
  char keybuf [256];
  fdb_kvs_handle *pfStack_17d58;
  undefined1 auStack_17d50 [16];
  undefined1 auStack_17d40 [8];
  undefined1 auStack_17d38 [80];
  ulong uStack_17ce8;
  timeval tStack_17cc8;
  fdb_file_info afStack_17cb8 [3];
  fdb_file_info afStack_17bb8 [3];
  fdb_config fStack_17ab8;
  fdb_kvs_handle *pfStack_179c0;
  fdb_kvs_handle *pfStack_179b8;
  fdb_kvs_handle *pfStack_179b0;
  fdb_config *pfStack_179a8;
  fdb_doc **ppfStack_179a0;
  fdb_kvs_handle *pfStack_17998;
  fdb_file_handle *pfStack_17988;
  fdb_kvs_handle *pfStack_17980;
  timeval atStack_17978 [2];
  timeval tStack_17958;
  timeval tStack_17948;
  undefined1 auStack_17938 [70];
  undefined1 uStack_178f2;
  undefined8 uStack_178e8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_17828;
  fdb_kvs_handle *pfStack_17820;
  fdb_kvs_handle *pfStack_17818;
  fdb_kvs_handle *pfStack_17810;
  fdb_doc **ppfStack_17808;
  fdb_kvs_handle *pfStack_17800;
  undefined1 auStack_177e8 [16];
  fdb_kvs_handle *pfStack_177d8;
  fdb_kvs_handle *pfStack_177d0;
  fdb_kvs_handle *pfStack_177c8;
  fdb_kvs_handle *pfStack_177c0;
  fdb_kvs_handle *pfStack_177b8;
  fdb_kvs_config fStack_177b0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_17798;
  filemgr *pfStack_17790;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_17788;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_17780;
  filemgr *pfStack_17778;
  fdb_kvs_handle *pfStack_17770;
  timeval tStack_17768;
  undefined1 auStack_17758 [256];
  __atomic_base<unsigned_long> _Stack_17658;
  timeval tStack_17650;
  __atomic_base<unsigned_long> _Stack_17640;
  fdb_doc *apfStack_175f8 [32];
  char acStack_174f8 [256];
  char acStack_173f8 [256];
  fdb_kvs_handle afStack_172f8 [153];
  char acStack_3a78 [8];
  fdb_kvs_handle *pfStack_3a70;
  fdb_kvs_handle *pfStack_3a68;
  fdb_kvs_handle *pfStack_3a60;
  fdb_kvs_handle *pfStack_3a58;
  fdb_doc **ppfStack_3a50;
  fdb_kvs_handle *pfStack_3a48;
  fdb_kvs_handle *pfStack_3a30;
  fdb_kvs_handle *pfStack_3a28;
  fdb_doc *pfStack_3a20;
  void *pvStack_3a18;
  fdb_kvs_config fStack_3a10;
  undefined1 auStack_39f8 [48];
  timeval tStack_39c8;
  undefined1 auStack_39b8 [760];
  char acStack_36c0 [256];
  fdb_doc *apfStack_35c0 [101];
  fdb_kvs_handle **ppfStack_3298;
  fdb_kvs_handle *pfStack_3290;
  fdb_kvs_handle *pfStack_3288;
  fdb_kvs_info *pfStack_3280;
  fdb_doc **ppfStack_3278;
  fdb_kvs_handle *pfStack_3270;
  undefined1 auStack_3258 [16];
  undefined1 auStack_3248 [24];
  undefined1 auStack_3230 [32];
  fdb_kvs_handle *apfStack_3210 [5];
  timeval tStack_31e8;
  char acStack_31d8 [256];
  fdb_doc *apfStack_30d8 [31];
  fdb_config fStack_2fe0;
  undefined1 auStack_2ee8 [752];
  undefined8 auStack_2bf8 [31];
  fdb_kvs_handle **ppfStack_2b00;
  fdb_kvs_handle *pfStack_2af8;
  fdb_kvs_handle *pfStack_2af0;
  fdb_kvs_config *pfStack_2ae8;
  fdb_doc **ppfStack_2ae0;
  fdb_kvs_handle *pfStack_2ad8;
  fdb_kvs_handle *pfStack_2ac0;
  fdb_kvs_handle *pfStack_2ab8;
  fdb_doc *pfStack_2ab0;
  fdb_kvs_handle *pfStack_2aa8;
  fdb_doc *apfStack_2aa0 [11];
  timeval tStack_2a48;
  fdb_kvs_config fStack_2a38;
  char acStack_2a20 [256];
  undefined1 auStack_2920 [656];
  fdb_config fStack_2690;
  fdb_kvs_handle **ppfStack_2598;
  fdb_kvs_handle *pfStack_2590;
  fdb_kvs_handle *pfStack_2588;
  btree *pbStack_2580;
  btree *pbStack_2578;
  fdb_kvs_handle *pfStack_2570;
  fdb_kvs_handle *pfStack_2560;
  fdb_kvs_handle *pfStack_2558;
  fdb_file_handle *pfStack_2550;
  fdb_kvs_handle *pfStack_2548;
  undefined1 auStack_2540 [40];
  undefined1 auStack_2518 [40];
  fdb_file_info fStack_24f0;
  undefined1 auStack_24a8 [768];
  char acStack_21a8 [264];
  code *pcStack_20a0;
  fdb_kvs_handle *pfStack_2098;
  fdb_kvs_handle *pfStack_2090;
  char *pcStack_2088;
  long lStack_2080;
  fdb_kvs_handle *pfStack_2078;
  fdb_snapshot_info_t *pfStack_2060;
  fdb_file_handle *pfStack_2058;
  char *pcStack_2050;
  int iStack_2044;
  undefined1 auStack_2040 [96];
  undefined1 auStack_1fe0 [32];
  timeval tStack_1fc0;
  fdb_kvs_handle fStack_1fb0;
  char acStack_1d10 [256];
  fdb_config fStack_1c10;
  size_t sStack_1b18;
  size_t sStack_1b10;
  fdb_doc **ppfStack_1b08;
  char *pcStack_1b00;
  code *pcStack_1af8;
  code *pcStack_1af0;
  fdb_file_handle *pfStack_1ad8;
  fdb_snapshot_info_t *pfStack_1ad0;
  uint64_t uStack_1ac8;
  uint uStack_1abc;
  fdb_kvs_handle *apfStack_1ab8 [4];
  fdb_kvs_config fStack_1a98;
  char acStack_1a80 [8];
  timeval tStack_1a78;
  char acStack_1a68 [256];
  char acStack_1968 [256];
  char acStack_1868 [264];
  fdb_config fStack_1760;
  fdb_doc *apfStack_1668 [301];
  fdb_kvs_handle **ppfStack_d00;
  void *pvStack_cf8;
  size_t sStack_cf0;
  fdb_kvs_handle *pfStack_ce8;
  btree *pbStack_ce0;
  code *pcStack_cd8;
  fdb_kvs_handle *pfStack_cc0;
  fdb_iterator *pfStack_cb8;
  fdb_kvs_handle *pfStack_cb0;
  undefined1 auStack_ca8 [16];
  undefined1 auStack_c98 [40];
  btree bStack_c70;
  fdb_kvs_info fStack_c28;
  fdb_config fStack_bf8;
  char acStack_b00 [256];
  char acStack_a00 [256];
  char acStack_900 [264];
  fdb_kvs_handle **ppfStack_7f8;
  fdb_kvs_handle *local_7c0;
  fdb_file_handle *local_7b8;
  fdb_kvs_config local_7b0;
  timeval local_798;
  fdb_kvs_info local_788;
  char local_758 [264];
  fdb_config local_650;
  char local_558 [256];
  char local_458 [256];
  fdb_doc *apfStack_358 [101];
  
  gettimeofday(&local_798,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  compact_test* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  local_650.wal_threshold = 0x400;
  local_650.flags = 1;
  local_650.compaction_threshold = '\0';
  fdb_open(&local_7b8,"./compact_test1",&local_650);
  fdb_kvs_open(local_7b8,&local_7c0,"db",&local_7b0);
  fVar3 = fdb_set_log_callback(local_7c0,logCallbackFunc,"compact_reopen_named_kvs");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    lVar24 = 0;
    uVar12 = 0;
    do {
      sprintf(local_458,"key%d",uVar12 & 0xffffffff);
      sprintf(local_558,"meta%d",uVar12 & 0xffffffff);
      sprintf(local_758,"body%d",uVar12 & 0xffffffff);
      sVar5 = strlen(local_458);
      sVar6 = strlen(local_558);
      sVar7 = strlen(local_758);
      fdb_doc_create((fdb_doc **)((long)apfStack_358 + lVar24),local_458,sVar5,local_558,sVar6,
                     local_758,sVar7);
      fdb_set(local_7c0,apfStack_358[uVar12]);
      uVar12 = uVar12 + 1;
      lVar24 = lVar24 + 8;
    } while (uVar12 != 100);
    fdb_commit(local_7b8,'\0');
    fdb_compact(local_7b8,(char *)0x0);
    fdb_get_kvs_info(local_7c0,&local_788);
    lVar24 = (long)(int)local_788.doc_count;
    fdb_kvs_close(local_7c0);
    fdb_close(local_7b8);
    fdb_open(&local_7b8,"./compact_test1",&local_650);
    fdb_kvs_open(local_7b8,&local_7c0,"db",&local_7b0);
    fdb_get_kvs_info(local_7c0,&local_788);
    if (lVar24 != CONCAT44(local_788.doc_count._4_4_,(int)local_788.doc_count)) {
      compact_reopen_named_kvs();
    }
    fdb_kvs_close(local_7c0);
    fdb_close(local_7b8);
    lVar24 = 0;
    do {
      fdb_doc_free(apfStack_358[lVar24]);
      lVar24 = lVar24 + 1;
    } while (lVar24 != 100);
    fdb_shutdown();
    memleak_end();
    pcVar20 = "%s PASSED\n";
    if (compact_reopen_named_kvs()::__test_pass != '\0') {
      pcVar20 = "%s FAILED\n";
    }
    fprintf(_stderr,pcVar20,"compact reopen named kvs");
    return;
  }
  compact_reopen_named_kvs();
  pcStack_cd8 = (code *)0x10d8b6;
  ppfStack_7f8 = &local_7c0;
  gettimeofday((timeval *)(auStack_c98 + 0x18),(__timezone_ptr_t)0x0);
  pcStack_cd8 = (code *)0x10d8bb;
  memleak_start();
  pfStack_cb0 = (fdb_kvs_handle *)0x0;
  pcStack_cd8 = (code *)0x10d8d0;
  system("rm -rf  compact_test* > errorlog.txt");
  pcStack_cd8 = (code *)0x10d8e0;
  fdb_get_default_config();
  pfVar8 = (fdb_kvs_handle *)auStack_c98;
  pcStack_cd8 = (code *)0x10d8ed;
  fdb_get_default_kvs_config();
  fStack_bf8.wal_threshold = 0x400;
  fStack_bf8.flags = 1;
  fStack_bf8.compaction_threshold = '\0';
  pbVar26 = (btree *)auStack_ca8;
  pcStack_cd8 = (code *)0x10d917;
  fdb_open((fdb_file_handle **)pbVar26,"./compact_test1",&fStack_bf8);
  ppfVar15 = &pfStack_cc0;
  pcStack_cd8 = (code *)0x10d931;
  fdb_kvs_open((fdb_file_handle *)auStack_ca8._0_8_,ppfVar15,"db",(fdb_kvs_config *)pfVar8);
  pcStack_cd8 = (code *)0x10d947;
  pfVar11 = pfStack_cc0;
  fVar3 = fdb_set_log_callback(pfStack_cc0,logCallbackFunc,"compact_reopen_with_iterator");
  uVar23 = (uint)pfVar11;
  if (fVar3 == FDB_RESULT_SUCCESS) {
    unaff_R12 = (void *)0x0;
    uVar12 = 0;
    do {
      pcStack_cd8 = (code *)0x10d96f;
      sprintf(acStack_900,"key%d",uVar12 & 0xffffffff);
      pcStack_cd8 = (code *)0x10d987;
      sprintf(acStack_a00,"meta%d",uVar12 & 0xffffffff);
      pcStack_cd8 = (code *)0x10d99f;
      sprintf(acStack_b00,"body%d",uVar12 & 0xffffffff);
      pbVar26 = (btree *)(&bStack_c70.ksize + (long)unaff_R12);
      pcStack_cd8 = (code *)0x10d9af;
      unaff_R13 = strlen(acStack_900);
      unaff_RBP = acStack_a00;
      pcStack_cd8 = (code *)0x10d9c2;
      pfVar8 = (fdb_kvs_handle *)strlen(unaff_RBP);
      pcStack_cd8 = (code *)0x10d9d2;
      sVar5 = strlen(acStack_b00);
      pcStack_cd8 = (code *)0x10d9f7;
      fdb_doc_create((fdb_doc **)pbVar26,acStack_900,unaff_R13,unaff_RBP,(size_t)pfVar8,acStack_b00,
                     sVar5);
      pcStack_cd8 = (code *)0x10da06;
      fdb_set(pfStack_cc0,*(fdb_doc **)(&bStack_c70.ksize + uVar12 * 8));
      uVar12 = uVar12 + 1;
      unaff_R12 = (void *)((long)unaff_R12 + 8);
    } while (uVar12 != 9);
    pcStack_cd8 = (code *)0x10da23;
    fdb_commit((fdb_file_handle *)auStack_ca8._0_8_,'\0');
    ppfVar15 = (fdb_kvs_handle **)(auStack_ca8 + 8);
    pcStack_cd8 = (code *)0x10da3f;
    fdb_open((fdb_file_handle **)ppfVar15,"./compact_test1",&fStack_bf8);
    pcStack_cd8 = (code *)0x10da4e;
    pfVar21 = (fdb_file_handle *)auStack_ca8._8_8_;
    fVar3 = fdb_compact((fdb_file_handle *)auStack_ca8._8_8_,"./compact_test2");
    uVar23 = (uint)pfVar21;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010dc71;
    pcStack_cd8 = (code *)0x10da60;
    fdb_close((fdb_file_handle *)auStack_ca8._8_8_);
    pcStack_cd8 = (code *)0x10da80;
    pfVar11 = pfStack_cc0;
    fVar3 = fdb_iterator_init(pfStack_cc0,&pfStack_cb8,(void *)0x0,0,(void *)0x0,0,0);
    uVar23 = (uint)pfVar11;
    pfVar11 = pfVar8;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010dc76;
    unaff_R13 = 0;
    ppfVar15 = &pfStack_cb0;
    do {
      pcStack_cd8 = (code *)0x10da9d;
      fVar3 = fdb_iterator_get(pfStack_cb8,(fdb_doc **)ppfVar15);
      pfVar11 = pfStack_cb0;
      if (fVar3 != FDB_RESULT_SUCCESS) {
LAB_0010dc51:
        pcStack_cd8 = (code *)0x10dc56;
        compact_reopen_with_iterator();
LAB_0010dc56:
        pcStack_cd8 = (code *)0x10dc61;
        compact_reopen_with_iterator();
LAB_0010dc61:
        pcStack_cd8 = (code *)0x10dc6c;
        pvVar14 = unaff_R12;
        compact_reopen_with_iterator();
        uVar23 = (uint)pvVar14;
        goto LAB_0010dc6c;
      }
      pbVar26 = (btree *)pfStack_cb0->op_stats;
      unaff_RBP = *(char **)(&bStack_c70.ksize + unaff_R13 * 8);
      unaff_R12 = *(void **)(unaff_RBP + 0x20);
      pcStack_cd8 = (code *)0x10dac5;
      iVar4 = bcmp(pbVar26,unaff_R12,*(size_t *)&pfStack_cb0->kvs_config);
      pfVar8 = pfVar11;
      if (iVar4 != 0) {
        pcStack_cd8 = (code *)0x10dc51;
        compact_reopen_with_iterator();
        goto LAB_0010dc51;
      }
      pbVar26 = pfVar11->staletree;
      unaff_R12 = *(void **)(unaff_RBP + 0x38);
      pcStack_cd8 = (code *)0x10dae4;
      iVar4 = bcmp(pbVar26,unaff_R12,(size_t)(pfVar11->kvs_config).custom_cmp);
      if (iVar4 != 0) goto LAB_0010dc61;
      pbVar26 = (pfVar11->field_6).seqtree;
      unaff_R12 = *(void **)(unaff_RBP + 0x40);
      pcStack_cd8 = (code *)0x10db03;
      iVar4 = bcmp(pbVar26,unaff_R12,(size_t)(pfVar11->kvs_config).custom_cmp_param);
      if (iVar4 != 0) goto LAB_0010dc56;
      pcStack_cd8 = (code *)0x10db13;
      fdb_doc_free((fdb_doc *)pfVar11);
      pfStack_cb0 = (fdb_kvs_handle *)0x0;
      unaff_R13 = unaff_R13 + 1;
      pcStack_cd8 = (code *)0x10db29;
      pfVar22 = pfStack_cb8;
      fVar3 = fdb_iterator_next(pfStack_cb8);
      uVar23 = (uint)pfVar22;
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    if ((int)unaff_R13 != 9) goto LAB_0010dc7b;
    pcStack_cd8 = (code *)0x10db46;
    fVar3 = fdb_iterator_close(pfStack_cb8);
    uVar23 = (uint)pfStack_cb8;
    if (fVar3 == FDB_RESULT_SUCCESS) {
      pcStack_cd8 = (code *)0x10db66;
      fdb_get_kvs_info(pfStack_cc0,&fStack_c28);
      lVar24 = (long)(int)fStack_c28.doc_count;
      pcStack_cd8 = (code *)0x10db72;
      fdb_kvs_close(pfStack_cc0);
      pcStack_cd8 = (code *)0x10db80;
      fdb_close((fdb_file_handle *)auStack_ca8._0_8_);
      pcStack_cd8 = (code *)0x10db97;
      fdb_open((fdb_file_handle **)auStack_ca8,"./compact_test2",&fStack_bf8);
      pcStack_cd8 = (code *)0x10dbaf;
      fdb_kvs_open((fdb_file_handle *)auStack_ca8._0_8_,&pfStack_cc0,"db",
                   (fdb_kvs_config *)auStack_c98);
      pcStack_cd8 = (code *)0x10dbba;
      fdb_get_kvs_info(pfStack_cc0,&fStack_c28);
      if (lVar24 != CONCAT44(fStack_c28.doc_count._4_4_,(int)fStack_c28.doc_count)) {
        pcStack_cd8 = (code *)0x10dbd0;
        compact_reopen_with_iterator();
      }
      pcStack_cd8 = (code *)0x10dbda;
      fdb_kvs_close(pfStack_cc0);
      pcStack_cd8 = (code *)0x10dbe4;
      fdb_close((fdb_file_handle *)auStack_ca8._0_8_);
      lVar24 = 0;
      do {
        pcStack_cd8 = (code *)0x10dbf0;
        fdb_doc_free(*(fdb_doc **)(&bStack_c70.ksize + lVar24 * 8));
        lVar24 = lVar24 + 1;
      } while (lVar24 != 9);
      pcStack_cd8 = (code *)0x10dbfe;
      fdb_shutdown();
      pcStack_cd8 = (code *)0x10dc03;
      memleak_end();
      pcVar20 = "%s PASSED\n";
      if (compact_reopen_with_iterator()::__test_pass != '\0') {
        pcVar20 = "%s FAILED\n";
      }
      pcStack_cd8 = (code *)0x10dc34;
      fprintf(_stderr,pcVar20,"compact reopen with iterator");
      return;
    }
  }
  else {
LAB_0010dc6c:
    pcStack_cd8 = (code *)0x10dc71;
    compact_reopen_with_iterator();
LAB_0010dc71:
    pcStack_cd8 = (code *)0x10dc76;
    compact_reopen_with_iterator();
    pfVar11 = pfVar8;
LAB_0010dc76:
    pcStack_cd8 = (code *)0x10dc7b;
    compact_reopen_with_iterator();
LAB_0010dc7b:
    pcStack_cd8 = (code *)0x10dc80;
    compact_reopen_with_iterator();
  }
  pcStack_cd8 = estimate_space_upto_test;
  compact_reopen_with_iterator();
  pcStack_1af0 = (code *)0x10dca7;
  ppfStack_d00 = ppfVar15;
  pvStack_cf8 = unaff_R12;
  sStack_cf0 = unaff_R13;
  pfStack_ce8 = pfVar11;
  pbStack_ce0 = pbVar26;
  pcStack_cd8 = (code *)unaff_RBP;
  gettimeofday(&tStack_1a78,(__timezone_ptr_t)0x0);
  pcStack_1af0 = (code *)0x10dcac;
  memleak_start();
  pcStack_1af0 = (code *)0x10dcbc;
  fdb_get_default_config();
  pcStack_1af0 = (code *)0x10dcc6;
  fdb_get_default_kvs_config();
  fStack_1760.buffercache_size = 0;
  fStack_1760.wal_threshold = 0x32;
  fStack_1760.flags = 1;
  fStack_1760.compaction_threshold = '\0';
  fStack_1760.block_reusing_threshold = 0;
  pcStack_1af0 = (code *)0x10dcf4;
  fStack_1760.multi_kv_instances = (bool)(char)uVar23;
  system("rm -rf  compact_test* > errorlog.txt");
  pcStack_1af0 = (code *)0x10dd08;
  fdb_open(&pfStack_1ad8,"./compact_test1",&fStack_1760);
  uStack_1abc = uVar23;
  if (uVar23 == 0) {
    pcStack_1af0 = (code *)0x10dd74;
    fdb_kvs_open_default(pfStack_1ad8,apfStack_1ab8,&fStack_1a98);
    sVar13 = 1;
  }
  else {
    ppfVar15 = apfStack_1ab8;
    uVar12 = 0;
    do {
      pcStack_1af0 = (code *)0x10dd39;
      sprintf(acStack_1a80,"kv%d",uVar12 & 0xffffffff);
      pcStack_1af0 = (code *)0x10dd4c;
      fdb_kvs_open(pfStack_1ad8,ppfVar15,acStack_1a80,&fStack_1a98);
      uVar12 = uVar12 + 1;
      ppfVar15 = ppfVar15 + 1;
    } while (uVar12 != 4);
    sVar13 = 4;
  }
  uVar12 = 0;
  do {
    pcStack_1af0 = (code *)0x10dd98;
    sprintf(acStack_1868,"key%d",uVar12 & 0xffffffff);
    pcStack_1af0 = (code *)0x10ddb1;
    sprintf(acStack_1968,"meta%d",uVar12 & 0xffffffff);
    pcStack_1af0 = (code *)0x10ddca;
    sprintf(acStack_1a68,"body%d",uVar12 & 0xffffffff);
    pcStack_1af0 = (code *)0x10dddd;
    sVar5 = strlen(acStack_1868);
    pcStack_1af0 = (code *)0x10ddf0;
    sVar6 = strlen(acStack_1968);
    pcStack_1af0 = (code *)0x10de00;
    sVar7 = strlen(acStack_1a68);
    pcStack_1af0 = (code *)0x10de25;
    fdb_doc_create(apfStack_1668 + uVar12,acStack_1868,sVar5,acStack_1968,sVar6,acStack_1a68,sVar7);
    sVar29 = 0;
    do {
      pcStack_1af0 = (code *)0x10de36;
      fdb_set(apfStack_1ab8[sVar29],apfStack_1668[uVar12]);
      sVar29 = sVar29 + 1;
    } while (sVar13 != sVar29);
    uVar12 = uVar12 + 1;
  } while (uVar12 != 0x4b);
  pcStack_1af0 = (code *)0x10de5a;
  fdb_commit(pfStack_1ad8,'\x01');
  uVar12 = 0x4b;
  do {
    pcStack_1af0 = (code *)0x10de7c;
    sprintf(acStack_1868,"key%d",uVar12 & 0xffffffff);
    pcStack_1af0 = (code *)0x10de95;
    sprintf(acStack_1968,"meta%d",uVar12 & 0xffffffff);
    pcStack_1af0 = (code *)0x10deae;
    sprintf(acStack_1a68,"body%d",uVar12 & 0xffffffff);
    pcStack_1af0 = (code *)0x10dec1;
    sVar5 = strlen(acStack_1868);
    pcStack_1af0 = (code *)0x10ded4;
    sVar6 = strlen(acStack_1968);
    pcStack_1af0 = (code *)0x10dee4;
    sVar7 = strlen(acStack_1a68);
    pcStack_1af0 = (code *)0x10df09;
    fdb_doc_create(apfStack_1668 + uVar12,acStack_1868,sVar5,acStack_1968,sVar6,acStack_1a68,sVar7);
    sVar29 = 0;
    do {
      pcStack_1af0 = (code *)0x10df1a;
      fdb_set(apfStack_1ab8[sVar29],apfStack_1668[uVar12]);
      sVar29 = sVar29 + 1;
    } while (sVar13 != sVar29);
    uVar12 = uVar12 + 1;
  } while (uVar12 != 0x96);
  lVar24 = 0;
  do {
    sVar29 = 0;
    do {
      pcStack_1af0 = (code *)0x10df4a;
      fdb_set(apfStack_1ab8[sVar29],apfStack_1668[lVar24]);
      sVar29 = sVar29 + 1;
    } while (sVar13 != sVar29);
    lVar24 = lVar24 + 1;
  } while (lVar24 != 0x4b);
  lVar24 = 0;
  do {
    sVar29 = 0;
    do {
      pcStack_1af0 = (code *)0x10df73;
      fdb_set(apfStack_1ab8[sVar29],apfStack_1668[lVar24]);
      sVar29 = sVar29 + 1;
    } while (sVar13 != sVar29);
    lVar24 = lVar24 + 1;
  } while (lVar24 != 0x4b);
  pcStack_1af0 = (code *)0x10df90;
  fdb_commit(pfStack_1ad8,'\0');
  uVar12 = 0x96;
  do {
    pcStack_1af0 = (code *)0x10dfb2;
    sprintf(acStack_1868,"key%d",uVar12 & 0xffffffff);
    pcStack_1af0 = (code *)0x10dfcb;
    sprintf(acStack_1968,"meta%d",uVar12 & 0xffffffff);
    pcStack_1af0 = (code *)0x10dfe4;
    sprintf(acStack_1a68,"body%d",uVar12 & 0xffffffff);
    pcStack_1af0 = (code *)0x10dff7;
    sVar5 = strlen(acStack_1868);
    pcStack_1af0 = (code *)0x10e00a;
    sVar6 = strlen(acStack_1968);
    pcStack_1af0 = (code *)0x10e01a;
    sVar7 = strlen(acStack_1a68);
    pcStack_1af0 = (code *)0x10e03f;
    fdb_doc_create(apfStack_1668 + uVar12,acStack_1868,sVar5,acStack_1968,sVar6,acStack_1a68,sVar7);
    sVar29 = 0;
    do {
      pcStack_1af0 = (code *)0x10e050;
      fdb_set(apfStack_1ab8[sVar29],apfStack_1668[uVar12]);
      sVar29 = sVar29 + 1;
    } while (sVar13 != sVar29);
    uVar12 = uVar12 + 1;
  } while (uVar12 != 0xe1);
  pcStack_1af0 = (code *)0x10e077;
  fdb_commit(pfStack_1ad8,'\x01');
  uVar12 = 0xe1;
  do {
    pcStack_1af0 = (code *)0x10e099;
    sprintf(acStack_1868,"key%d",uVar12 & 0xffffffff);
    pcStack_1af0 = (code *)0x10e0b2;
    sprintf(acStack_1968,"meta%d",uVar12 & 0xffffffff);
    pcStack_1af0 = (code *)0x10e0cb;
    sprintf(acStack_1a68,"body%d",uVar12 & 0xffffffff);
    ppfVar30 = apfStack_1668 + uVar12;
    pcStack_1af0 = (code *)0x10e0de;
    sVar5 = strlen(acStack_1868);
    pcStack_1af0 = (code *)0x10e0f1;
    sVar6 = strlen(acStack_1968);
    pcStack_1af0 = (code *)0x10e101;
    sVar7 = strlen(acStack_1a68);
    pcStack_1af0 = (code *)0x10e126;
    fdb_doc_create(ppfVar30,acStack_1868,sVar5,acStack_1968,sVar6,acStack_1a68,sVar7);
    sVar29 = 0;
    do {
      pcStack_1af0 = (code *)0x10e137;
      fdb_set(apfStack_1ab8[sVar29],*ppfVar30);
      sVar29 = sVar29 + 1;
    } while (sVar13 != sVar29);
    uVar12 = uVar12 + 1;
  } while (uVar12 != 300);
  sVar29 = 0;
  pcStack_1af0 = (code *)0x10e15e;
  fdb_commit(pfStack_1ad8,'\0');
  do {
    pfVar8 = apfStack_1ab8[sVar29];
    pcStack_1af0 = (code *)0x10e17c;
    fVar3 = fdb_set_log_callback(pfVar8,logCallbackFunc,"estimate_space_upto_test");
    iVar4 = (int)pfVar8;
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pcStack_1af0 = (code *)0x10e2f3;
      estimate_space_upto_test();
      goto LAB_0010e2f3;
    }
    sVar29 = sVar29 + 1;
  } while (sVar13 != sVar29);
  pcStack_1af0 = (code *)0x10e1a0;
  pfVar21 = pfStack_1ad8;
  fVar3 = fdb_get_all_snap_markers(pfStack_1ad8,&pfStack_1ad0,&uStack_1ac8);
  iVar4 = (int)pfVar21;
  if (fVar3 == FDB_RESULT_SUCCESS) {
    sVar5 = (size_t)uStack_1abc;
    cVar18 = (char)uStack_1abc;
    uVar10 = uStack_1ac8;
    if (cVar18 != '\0') {
      if (uStack_1ac8 != 8) {
        pcStack_1af0 = (code *)0x10e1c6;
        estimate_space_upto_test();
      }
      pcStack_1af0 = (code *)0x10e1d9;
      sVar13 = fdb_estimate_space_used_from(pfStack_1ad8,pfStack_1ad0[1].marker);
      pcStack_1af0 = (code *)0x10e1ef;
      sVar9 = fdb_estimate_space_used_from(pfStack_1ad8,pfStack_1ad0[2].marker);
      if (sVar9 <= sVar13) {
        pcStack_1af0 = (code *)0x10e1f9;
        estimate_space_upto_test();
        uVar10 = extraout_RAX;
        goto LAB_0010e1f9;
      }
LAB_0010e23b:
      pcStack_1af0 = (code *)0x10e24a;
      fVar3 = fdb_free_snap_markers(pfStack_1ad0,uStack_1ac8);
      iVar4 = (int)pfStack_1ad0;
      if (fVar3 == FDB_RESULT_SUCCESS) {
        pcStack_1af0 = (code *)0x10e25c;
        fdb_close(pfStack_1ad8);
        lVar24 = 0;
        do {
          pcStack_1af0 = (code *)0x10e26b;
          fdb_doc_free(apfStack_1668[lVar24]);
          lVar24 = lVar24 + 1;
        } while (lVar24 != 300);
        pcStack_1af0 = (code *)0x10e27c;
        fdb_shutdown();
        pcStack_1af0 = (code *)0x10e281;
        memleak_end();
        pcVar20 = "single kv mode:";
        if (cVar18 != '\0') {
          pcVar20 = "multiple kv mode:";
        }
        pcStack_1af0 = (code *)0x10e2af;
        sprintf(acStack_1a68,"estimate space upto marker in file test %s",pcVar20);
        pcVar20 = "%s PASSED\n";
        if (estimate_space_upto_test(bool)::__test_pass != '\0') {
          pcVar20 = "%s FAILED\n";
        }
        pcStack_1af0 = (code *)0x10e2dc;
        fprintf(_stderr,pcVar20,acStack_1a68);
        return;
      }
      goto LAB_0010e2f8;
    }
LAB_0010e1f9:
    if (uVar10 != 4) {
      pcStack_1af0 = (code *)0x10e209;
      estimate_space_upto_test();
    }
    pcStack_1af0 = (code *)0x10e21c;
    sVar13 = fdb_estimate_space_used_from(pfStack_1ad8,pfStack_1ad0[1].marker);
    pcStack_1af0 = (code *)0x10e232;
    pfVar21 = pfStack_1ad8;
    sVar9 = fdb_estimate_space_used_from(pfStack_1ad8,pfStack_1ad0[2].marker);
    iVar4 = (int)pfVar21;
    if (sVar13 < sVar9) goto LAB_0010e23b;
  }
  else {
LAB_0010e2f3:
    pcStack_1af0 = (code *)0x10e2f8;
    estimate_space_upto_test();
LAB_0010e2f8:
    pcStack_1af0 = (code *)0x10e2fd;
    estimate_space_upto_test();
  }
  pcStack_1af0 = compact_upto_test;
  estimate_space_upto_test();
  pcStack_1af8 = logCallbackFunc;
  pcStack_1b00 = "estimate_space_upto_test";
  pfStack_2078 = (fdb_kvs_handle *)0x10e327;
  sStack_1b18 = sVar13;
  sStack_1b10 = sVar29;
  ppfStack_1b08 = ppfVar30;
  pcStack_1af0 = (code *)sVar5;
  gettimeofday(&tStack_1fc0,(__timezone_ptr_t)0x0);
  pfStack_2078 = (fdb_kvs_handle *)0x10e32c;
  memleak_start();
  pfStack_2078 = (fdb_kvs_handle *)0x10e33c;
  fdb_get_default_config();
  pfStack_2078 = (fdb_kvs_handle *)0x10e346;
  fdb_get_default_kvs_config();
  fStack_1c10.buffercache_size = 0;
  fStack_1c10.wal_threshold = 0x400;
  fStack_1c10.flags = 1;
  fStack_1c10.compaction_threshold = '\0';
  fStack_1c10.block_reusing_threshold = 0;
  pfStack_2078 = (fdb_kvs_handle *)0x10e374;
  fStack_1c10.multi_kv_instances = (bool)(char)iVar4;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_2078 = (fdb_kvs_handle *)0x10e388;
  fdb_open(&pfStack_2058,"./compact_test1",&fStack_1c10);
  iStack_2044 = iVar4;
  if (iVar4 == 0) {
    pfStack_2078 = (fdb_kvs_handle *)0x10e3f4;
    fdb_kvs_open_default
              (pfStack_2058,(fdb_kvs_handle **)(auStack_2040 + 0x20),
               (fdb_kvs_config *)(auStack_2040 + 0x48));
    uVar23 = 1;
  }
  else {
    ppfVar15 = (fdb_kvs_handle **)(auStack_2040 + 0x20);
    uVar12 = 0;
    do {
      pfStack_2078 = (fdb_kvs_handle *)0x10e3b9;
      sprintf(auStack_2040,"kv%d",uVar12 & 0xffffffff);
      pfStack_2078 = (fdb_kvs_handle *)0x10e3cc;
      fdb_kvs_open(pfStack_2058,ppfVar15,auStack_2040,(fdb_kvs_config *)(auStack_2040 + 0x48));
      uVar12 = uVar12 + 1;
      ppfVar15 = ppfVar15 + 1;
    } while (uVar12 != 4);
    uVar23 = 4;
  }
  pfVar8 = (fdb_kvs_handle *)(ulong)uVar23;
  uVar12 = 0;
  do {
    pfStack_2078 = (fdb_kvs_handle *)0x10e41a;
    sprintf((char *)&fStack_1fb0.kv_info_offset,"key%d",uVar12 & 0xffffffff);
    pfStack_2078 = (fdb_kvs_handle *)0x10e433;
    sprintf((char *)&fStack_1fb0.config.compaction_minimum_filesize,"meta%d",uVar12 & 0xffffffff);
    pfStack_2078 = (fdb_kvs_handle *)0x10e44c;
    sprintf(acStack_1d10,"body%d",uVar12 & 0xffffffff);
    pbVar25 = &fStack_1fb0.kvs_config.create_if_missing + uVar12 * 8;
    pfStack_2078 = (fdb_kvs_handle *)0x10e45f;
    sVar5 = strlen((char *)&fStack_1fb0.kv_info_offset);
    puVar1 = &fStack_1fb0.config.compaction_minimum_filesize;
    pfStack_2078 = (fdb_kvs_handle *)0x10e472;
    sVar6 = strlen((char *)puVar1);
    pfStack_2078 = (fdb_kvs_handle *)0x10e482;
    sVar7 = strlen(acStack_1d10);
    pfStack_2078 = (fdb_kvs_handle *)0x10e4a7;
    fdb_doc_create((fdb_doc **)pbVar25,&fStack_1fb0.kv_info_offset,sVar5,puVar1,sVar6,acStack_1d10,
                   sVar7);
    lVar24 = 0;
    do {
      pfStack_2078 = (fdb_kvs_handle *)0x10e4b8;
      fdb_set(*(fdb_kvs_handle **)(auStack_2040 + lVar24 * 8 + 0x20),*(fdb_doc **)pbVar25);
      lVar24 = lVar24 + 1;
    } while (pfVar8 != (fdb_kvs_handle *)lVar24);
    uVar12 = uVar12 + 1;
  } while (uVar12 != 5);
  pfStack_2078 = (fdb_kvs_handle *)0x10e4dc;
  fdb_commit(pfStack_2058,'\x01');
  uVar12 = 5;
  do {
    pfStack_2078 = (fdb_kvs_handle *)0x10e4fe;
    sprintf((char *)&fStack_1fb0.kv_info_offset,"key%d",uVar12 & 0xffffffff);
    puVar1 = &fStack_1fb0.config.compaction_minimum_filesize;
    pfStack_2078 = (fdb_kvs_handle *)0x10e51a;
    sprintf((char *)puVar1,"meta%d",uVar12 & 0xffffffff);
    pfStack_2078 = (fdb_kvs_handle *)0x10e536;
    sprintf(acStack_1d10,"body%d",uVar12 & 0xffffffff);
    pbVar25 = &fStack_1fb0.kvs_config.create_if_missing + uVar12 * 8;
    pfStack_2078 = (fdb_kvs_handle *)0x10e549;
    sVar5 = strlen((char *)&fStack_1fb0.kv_info_offset);
    pfStack_2078 = (fdb_kvs_handle *)0x10e554;
    sVar6 = strlen((char *)puVar1);
    pfStack_2078 = (fdb_kvs_handle *)0x10e55f;
    sVar7 = strlen(acStack_1d10);
    pfStack_2078 = (fdb_kvs_handle *)0x10e584;
    fdb_doc_create((fdb_doc **)pbVar25,&fStack_1fb0.kv_info_offset,sVar5,
                   &fStack_1fb0.config.compaction_minimum_filesize,sVar6,acStack_1d10,sVar7);
    lVar24 = 0;
    do {
      pfStack_2078 = (fdb_kvs_handle *)0x10e594;
      fdb_set(*(fdb_kvs_handle **)(auStack_2040 + lVar24 * 8 + 0x20),*(fdb_doc **)pbVar25);
      lVar24 = lVar24 + 1;
    } while (pfVar8 != (fdb_kvs_handle *)lVar24);
    uVar12 = uVar12 + 1;
  } while (uVar12 != 10);
  pfStack_2078 = (fdb_kvs_handle *)0x10e5b5;
  fdb_commit(pfStack_2058,'\0');
  uVar12 = 10;
  do {
    pfStack_2078 = (fdb_kvs_handle *)0x10e5d7;
    sprintf((char *)&fStack_1fb0.kv_info_offset,"key%d",uVar12 & 0xffffffff);
    puVar1 = &fStack_1fb0.config.compaction_minimum_filesize;
    pfStack_2078 = (fdb_kvs_handle *)0x10e5f3;
    sprintf((char *)puVar1,"meta%d",uVar12 & 0xffffffff);
    pfStack_2078 = (fdb_kvs_handle *)0x10e60f;
    sprintf(acStack_1d10,"body%d",uVar12 & 0xffffffff);
    pbVar25 = &fStack_1fb0.kvs_config.create_if_missing + uVar12 * 8;
    pfStack_2078 = (fdb_kvs_handle *)0x10e622;
    sVar5 = strlen((char *)&fStack_1fb0.kv_info_offset);
    pfStack_2078 = (fdb_kvs_handle *)0x10e62d;
    sVar6 = strlen((char *)puVar1);
    pfStack_2078 = (fdb_kvs_handle *)0x10e638;
    sVar7 = strlen(acStack_1d10);
    pfStack_2078 = (fdb_kvs_handle *)0x10e65d;
    fdb_doc_create((fdb_doc **)pbVar25,&fStack_1fb0.kv_info_offset,sVar5,
                   &fStack_1fb0.config.compaction_minimum_filesize,sVar6,acStack_1d10,sVar7);
    lVar24 = 0;
    do {
      pfStack_2078 = (fdb_kvs_handle *)0x10e66d;
      fdb_set(*(fdb_kvs_handle **)(auStack_2040 + lVar24 * 8 + 0x20),*(fdb_doc **)pbVar25);
      lVar24 = lVar24 + 1;
    } while (pfVar8 != (fdb_kvs_handle *)lVar24);
    uVar12 = uVar12 + 1;
  } while (uVar12 != 0xf);
  pfStack_2078 = (fdb_kvs_handle *)0x10e691;
  fdb_commit(pfStack_2058,'\x01');
  uVar12 = 0xf;
  do {
    pfStack_2078 = (fdb_kvs_handle *)0x10e6b3;
    sprintf((char *)&fStack_1fb0.kv_info_offset,"key%d",uVar12 & 0xffffffff);
    puVar1 = &fStack_1fb0.config.compaction_minimum_filesize;
    pfStack_2078 = (fdb_kvs_handle *)0x10e6cf;
    sprintf((char *)puVar1,"meta%d",uVar12 & 0xffffffff);
    pfStack_2078 = (fdb_kvs_handle *)0x10e6eb;
    sprintf(acStack_1d10,"body%d",uVar12 & 0xffffffff);
    pfVar11 = (fdb_kvs_handle *)(&fStack_1fb0.kvs_config.create_if_missing + uVar12 * 8);
    pfStack_2078 = (fdb_kvs_handle *)0x10e6fe;
    sVar5 = strlen((char *)&fStack_1fb0.kv_info_offset);
    pfStack_2078 = (fdb_kvs_handle *)0x10e709;
    handle = (fdb_kvs_handle *)strlen((char *)puVar1);
    pfStack_2078 = (fdb_kvs_handle *)0x10e714;
    sVar6 = strlen(acStack_1d10);
    pfStack_2078 = (fdb_kvs_handle *)0x10e739;
    fdb_doc_create((fdb_doc **)pfVar11,&fStack_1fb0.kv_info_offset,sVar5,
                   &fStack_1fb0.config.compaction_minimum_filesize,(size_t)handle,acStack_1d10,sVar6
                  );
    lVar24 = 0;
    do {
      pfStack_2078 = (fdb_kvs_handle *)0x10e749;
      fdb_set(*(fdb_kvs_handle **)(auStack_2040 + lVar24 * 8 + 0x20),
              *(fdb_doc **)&pfVar11->kvs_config);
      lVar24 = lVar24 + 1;
    } while (pfVar8 != (fdb_kvs_handle *)lVar24);
    uVar12 = uVar12 + 1;
  } while (uVar12 != 0x14);
  lVar24 = 0;
  pfStack_2078 = (fdb_kvs_handle *)0x10e76d;
  fdb_commit(pfStack_2058,'\0');
  __s = logCallbackFunc;
  pcVar20 = "compact_upto_test";
  do {
    pfStack_2078 = (fdb_kvs_handle *)0x10e78b;
    fVar3 = fdb_set_log_callback
                      (*(fdb_kvs_handle **)(auStack_2040 + lVar24 * 8 + 0x20),logCallbackFunc,
                       "compact_upto_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010eacf;
    lVar24 = lVar24 + 1;
  } while (pfVar8 != (fdb_kvs_handle *)lVar24);
  pfStack_2078 = (fdb_kvs_handle *)0x10e7af;
  fVar3 = fdb_get_all_snap_markers(pfStack_2058,&pfStack_2060,(uint64_t *)&pcStack_2050);
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010ead4;
  if ((char)iStack_2044 == '\0') {
    if (pcStack_2050 != (char *)0x4) {
      pfStack_2078 = (fdb_kvs_handle *)0x10e8c9;
      compact_upto_test();
    }
    if (pcStack_2050 != (char *)0x0) {
      lVar24 = 0x1400000000;
      handle = (fdb_kvs_handle *)0x0;
      pfVar11 = (fdb_kvs_handle *)0xfffffffb00000000;
      pcVar20 = (char *)0x0;
      do {
        if (*(long *)((long)&pfStack_2060->num_kvs_markers + (long)handle) != 1) {
          pfStack_2078 = (fdb_kvs_handle *)0x10eab6;
          compact_upto_test();
        }
        if (*(long *)(*(long *)((long)&pfStack_2060->kvs_markers + (long)handle) + 8) !=
            lVar24 >> 0x20) {
          pfStack_2078 = (fdb_kvs_handle *)0x10eac3;
          compact_upto_test();
        }
        pcVar20 = pcVar20 + 1;
        lVar24 = lVar24 + -0x500000000;
        handle = (fdb_kvs_handle *)((long)handle + 0x18);
      } while (pcVar20 < pcStack_2050);
    }
    __s = (code *)auStack_1fe0;
    pfStack_2078 = (fdb_kvs_handle *)0x10e8f3;
    sprintf((char *)__s,"compact_test_compact%d",1);
    pfStack_2078 = (fdb_kvs_handle *)0x10e909;
    fVar3 = fdb_compact_upto(pfStack_2058,(char *)__s,pfStack_2060[1].marker);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      pfStack_2078 = (fdb_kvs_handle *)0x10e92d;
      fVar3 = fdb_snapshot_open((fdb_kvs_handle *)auStack_2040._32_8_,
                                (fdb_kvs_handle **)(auStack_2040 + 0x18),
                                (pfStack_2060[1].kvs_markers)->seqnum);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_2078 = (fdb_kvs_handle *)0x10e936;
        compact_upto_test();
        goto LAB_0010e936;
      }
LAB_0010e996:
      __s = (code *)auStack_1fe0;
      pfStack_2078 = (fdb_kvs_handle *)0x10e9a0;
      fdb_kvs_close((fdb_kvs_handle *)auStack_2040._24_8_);
      pfStack_2078 = (fdb_kvs_handle *)0x10e9af;
      fVar3 = fdb_free_snap_markers(pfStack_2060,(uint64_t)pcStack_2050);
      if (fVar3 == FDB_RESULT_SUCCESS) {
        pfStack_2078 = (fdb_kvs_handle *)0x10e9c1;
        fdb_close(pfStack_2058);
        lVar24 = 0;
        do {
          pfStack_2078 = (fdb_kvs_handle *)0x10e9d0;
          fdb_doc_free(*(fdb_doc **)(&fStack_1fb0.kvs_config.create_if_missing + lVar24 * 8));
          lVar24 = lVar24 + 1;
        } while (lVar24 != 0x14);
        pfStack_2078 = (fdb_kvs_handle *)0x10e9de;
        fdb_shutdown();
        pfStack_2078 = (fdb_kvs_handle *)0x10e9e3;
        memleak_end();
        pcVar20 = "single kv mode:";
        if ((char)iStack_2044 != '\0') {
          pcVar20 = "multiple kv mode:";
        }
        pfStack_2078 = (fdb_kvs_handle *)0x10ea13;
        sprintf(acStack_1d10,"compact upto marker in file test %s",pcVar20);
        pcVar20 = "%s PASSED\n";
        if (compact_upto_test(bool)::__test_pass != '\0') {
          pcVar20 = "%s FAILED\n";
        }
        pfStack_2078 = (fdb_kvs_handle *)0x10ea40;
        fprintf(_stderr,pcVar20,acStack_1d10);
        return;
      }
      goto LAB_0010ead9;
    }
    goto LAB_0010eade;
  }
  if (pcStack_2050 != (char *)0x8) {
    pfStack_2078 = (fdb_kvs_handle *)0x10e7d7;
    compact_upto_test();
  }
  auStack_2040._8_8_ = ZEXT48(uVar23 + 1);
  handle = (fdb_kvs_handle *)auStack_2040;
  pvVar14 = (void *)0x0;
  do {
    pcVar20 = (char *)((long)pvVar14 * 3);
    if ((fdb_custom_cmp_variable)pfStack_2060[(long)pvVar14].num_kvs_markers !=
        (fdb_custom_cmp_variable)auStack_2040._8_8_) {
      pfStack_2078 = (fdb_kvs_handle *)0x10e8b4;
      compact_upto_test();
    }
    __s = (code *)((long)pvVar14 * -5 + 0x14);
    lVar24 = 8;
    pfVar11 = (fdb_kvs_handle *)0x0;
    auStack_2040._16_8_ = pvVar14;
    do {
      if (*(code **)(lVar24 + (long)&(pfStack_2060[(long)pvVar14].kvs_markers)->kv_store_name) !=
          __s) {
        pfStack_2078 = (fdb_kvs_handle *)0x10e88a;
        compact_upto_test();
      }
      pfStack_2078 = (fdb_kvs_handle *)0x10e83d;
      sprintf((char *)handle,"kv%d",(ulong)pfVar11 & 0xffffffff);
      psVar2 = *(short **)((long)&pfStack_2060[(long)pvVar14].kvs_markers[-1].seqnum + lVar24);
      if ((char)psVar2[1] != auStack_2040[2] || *psVar2 != auStack_2040._0_2_) {
        pfStack_2078 = (fdb_kvs_handle *)0x10eacf;
        compact_upto_test();
        goto LAB_0010eacf;
      }
      pfVar11 = (fdb_kvs_handle *)&(pfVar11->kvs_config).field_0x1;
      lVar24 = lVar24 + 0x10;
    } while (pfVar8 != pfVar11);
    pvVar14 = (void *)(auStack_2040._16_8_ + 1);
  } while ((fdb_kvs_handle *)pvVar14 != pfVar8);
LAB_0010e936:
  __s = (code *)auStack_1fe0;
  pfStack_2078 = (fdb_kvs_handle *)0x10e954;
  sprintf((char *)__s,"compact_test_compact%d",1);
  pfStack_2078 = (fdb_kvs_handle *)0x10e96a;
  fVar3 = fdb_compact_upto(pfStack_2058,(char *)__s,pfStack_2060[1].marker);
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010eae3;
  pfStack_2078 = (fdb_kvs_handle *)0x10e98e;
  fVar3 = fdb_snapshot_open((fdb_kvs_handle *)auStack_2040._40_8_,
                            (fdb_kvs_handle **)(auStack_2040 + 0x18),
                            pfStack_2060[1].kvs_markers[1].seqnum);
  if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_0010e996;
LAB_0010eae8:
  pfStack_2078 = (fdb_kvs_handle *)auto_recover_compact_ok_test;
  compact_upto_test();
  pfStack_2570 = (fdb_kvs_handle *)0x10eb0a;
  pcStack_20a0 = __s;
  pfStack_2098 = handle;
  pfStack_2090 = pfVar11;
  pcStack_2088 = pcVar20;
  lStack_2080 = lVar24;
  pfStack_2078 = pfVar8;
  gettimeofday((timeval *)(auStack_2518 + 0x18),(__timezone_ptr_t)0x0);
  pfStack_2570 = (fdb_kvs_handle *)0x10eb0f;
  memleak_start();
  pfStack_2570 = (fdb_kvs_handle *)0x10eb1b;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_2570 = (fdb_kvs_handle *)0x10eb2b;
  fdb_get_default_config();
  pbVar26 = (btree *)auStack_2518;
  pfStack_2570 = (fdb_kvs_handle *)0x10eb38;
  fdb_get_default_kvs_config();
  auStack_24a8[0x110] = '\0';
  auStack_24a8[0x111] = '\0';
  auStack_24a8[0x112] = '\0';
  auStack_24a8[0x113] = '\x01';
  auStack_24a8[0x114] = '\0';
  auStack_24a8[0x115] = '\0';
  auStack_24a8[0x116] = '\0';
  auStack_24a8[0x117] = '\0';
  auStack_24a8[0x118] = '\0';
  auStack_24a8[0x119] = '\x04';
  auStack_24a8[0x11a] = '\0';
  auStack_24a8[0x11b] = '\0';
  auStack_24a8[0x11c] = '\0';
  auStack_24a8[0x11d] = '\0';
  auStack_24a8[0x11e] = '\0';
  auStack_24a8[0x11f] = '\0';
  auStack_24a8._300_4_ = 1;
  auStack_24a8[0x137] = 0;
  ptr_fhandle_00 = (btree *)&pfStack_2550;
  pfStack_2570 = (fdb_kvs_handle *)0x10eb6a;
  fdb_open((fdb_file_handle **)ptr_fhandle_00,"./compact_test1",(fdb_config *)(auStack_24a8 + 0x108)
          );
  ppfVar15 = &pfStack_2558;
  pfStack_2570 = (fdb_kvs_handle *)0x10eb7d;
  fdb_kvs_open_default(pfStack_2550,ppfVar15,(fdb_kvs_config *)pbVar26);
  pfStack_2570 = (fdb_kvs_handle *)0x10eb93;
  fVar3 = fdb_set_log_callback(pfStack_2558,logCallbackFunc,"auto_recover_compact_ok_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pfStack_2570 = (fdb_kvs_handle *)0x10ebb7;
    fdb_open((fdb_file_handle **)auStack_2540,"./compact_test1",(fdb_config *)(auStack_24a8 + 0x108)
            );
    ppfVar15 = &pfStack_2548;
    pfStack_2570 = (fdb_kvs_handle *)0x10ebcc;
    fdb_kvs_open_default
              ((fdb_file_handle *)auStack_2540._0_8_,ppfVar15,(fdb_kvs_config *)auStack_2518);
    pfStack_2570 = (fdb_kvs_handle *)0x10ebe2;
    fVar3 = fdb_set_log_callback(pfStack_2548,logCallbackFunc,"auto_recover_compact_ok_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010efd1;
    lVar24 = 0;
    uVar12 = 0;
    do {
      pfStack_2570 = (fdb_kvs_handle *)0x10ec0a;
      sprintf(acStack_21a8,"key%d",uVar12 & 0xffffffff);
      pfStack_2570 = (fdb_kvs_handle *)0x10ec22;
      sprintf(auStack_24a8 + 0x200,"meta%d",uVar12 & 0xffffffff);
      pfStack_2570 = (fdb_kvs_handle *)0x10ec3a;
      sprintf(auStack_24a8,"body%d",uVar12 & 0xffffffff);
      pfStack_2570 = (fdb_kvs_handle *)0x10ec4a;
      sVar5 = strlen(acStack_21a8);
      pfStack_2570 = (fdb_kvs_handle *)0x10ec5d;
      sVar6 = strlen(auStack_24a8 + 0x200);
      pfStack_2570 = (fdb_kvs_handle *)0x10ec6d;
      sVar7 = strlen(auStack_24a8);
      pfStack_2570 = (fdb_kvs_handle *)0x10ec92;
      fdb_doc_create((fdb_doc **)(auStack_2540 + lVar24 + 8),acStack_21a8,sVar5,auStack_24a8 + 0x200
                     ,sVar6,auStack_24a8,sVar7);
      pfStack_2570 = (fdb_kvs_handle *)0x10eca1;
      fdb_set(pfStack_2558,*(fdb_doc **)(auStack_2540 + uVar12 * 8 + 8));
      uVar12 = uVar12 + 1;
      lVar24 = lVar24 + 8;
    } while (uVar12 == 1);
    pfStack_2570 = (fdb_kvs_handle *)0x10ece2;
    fdb_doc_create((fdb_doc **)&pfStack_2560,*(void **)(auStack_2540._16_8_ + 0x20),
                   *(size_t *)auStack_2540._16_8_,*(void **)(auStack_2540._16_8_ + 0x38),
                   *(size_t *)(auStack_2540._16_8_ + 8),(void *)0x0,0);
    *(bool *)&pfStack_2560->file = true;
    pfStack_2570 = (fdb_kvs_handle *)0x10ecf3;
    fdb_set(pfStack_2558,(fdb_doc *)pfStack_2560);
    pfStack_2570 = (fdb_kvs_handle *)0x10ecfb;
    fdb_doc_free((fdb_doc *)pfStack_2560);
    pfStack_2570 = (fdb_kvs_handle *)0x10ed0a;
    fdb_commit(pfStack_2550,'\x01');
    pfStack_2570 = (fdb_kvs_handle *)0x10ed1b;
    fdb_compact(pfStack_2550,"./compact_test2");
    pfStack_2570 = (fdb_kvs_handle *)0x10ed27;
    system("cp  compact_test1 compact_test11 > errorlog.txt");
    pfStack_2570 = (fdb_kvs_handle *)0x10ed45;
    sprintf(acStack_21a8,"key%d",2);
    ptr_fhandle_00 = (btree *)(auStack_24a8 + 0x200);
    pfStack_2570 = (fdb_kvs_handle *)0x10ed63;
    sprintf((char *)ptr_fhandle_00,"meta%d",2);
    handle = (fdb_kvs_handle *)auStack_24a8;
    pfStack_2570 = (fdb_kvs_handle *)0x10ed81;
    sprintf((char *)handle,"body%d",2);
    pfStack_2570 = (fdb_kvs_handle *)0x10ed89;
    pfVar11 = (fdb_kvs_handle *)strlen(acStack_21a8);
    pfStack_2570 = (fdb_kvs_handle *)0x10ed94;
    pfVar8 = (fdb_kvs_handle *)strlen((char *)ptr_fhandle_00);
    pfStack_2570 = (fdb_kvs_handle *)0x10ed9f;
    sVar5 = strlen((char *)handle);
    pfStack_2570 = (fdb_kvs_handle *)0x10edba;
    fdb_doc_create((fdb_doc **)(auStack_2540 + 0x18),acStack_21a8,(size_t)pfVar11,ptr_fhandle_00,
                   (size_t)pfVar8,handle,sVar5);
    pfStack_2570 = (fdb_kvs_handle *)0x10edc7;
    fdb_set(pfStack_2558,(fdb_doc *)auStack_2540._24_8_);
    pfStack_2570 = (fdb_kvs_handle *)0x10edd6;
    fdb_commit(pfStack_2550,'\x01');
    pfStack_2570 = (fdb_kvs_handle *)0x10ede0;
    fdb_kvs_close(pfStack_2558);
    ppfVar15 = &pfStack_2548;
    pfStack_2570 = (fdb_kvs_handle *)0x10eded;
    fdb_kvs_close(pfStack_2548);
    pfStack_2570 = (fdb_kvs_handle *)0x10edf7;
    fdb_close(pfStack_2550);
    pbVar26 = (btree *)auStack_2540;
    pfStack_2570 = (fdb_kvs_handle *)0x10ee04;
    fdb_close((fdb_file_handle *)auStack_2540._0_8_);
    pfStack_2570 = (fdb_kvs_handle *)0x10ee10;
    system("mv  compact_test11 compact_test1 > errorlog.txt");
    pfStack_2570 = (fdb_kvs_handle *)0x10ee27;
    fdb_open((fdb_file_handle **)pbVar26,"./compact_test1",(fdb_config *)(auStack_24a8 + 0x108));
    pfStack_2570 = (fdb_kvs_handle *)0x10ee37;
    fdb_kvs_open_default
              ((fdb_file_handle *)auStack_2540._0_8_,ppfVar15,(fdb_kvs_config *)auStack_2518);
    pfStack_2570 = (fdb_kvs_handle *)0x10ee4d;
    fVar3 = fdb_set_log_callback(pfStack_2548,logCallbackFunc,"auto_recover_compact_ok_test");
    if (fVar3 == FDB_RESULT_SUCCESS) {
      handle = (fdb_kvs_handle *)0x0;
      ppfVar15 = &pfStack_2560;
      while( true ) {
        pfStack_2570 = (fdb_kvs_handle *)0x10ee81;
        fdb_doc_create((fdb_doc **)ppfVar15,
                       (void *)(*(size_t **)(auStack_2540 + (long)handle * 8 + 8))[4],
                       **(size_t **)(auStack_2540 + (long)handle * 8 + 8),(void *)0x0,0,(void *)0x0,
                       0);
        pfStack_2570 = (fdb_kvs_handle *)0x10ee90;
        fVar3 = fdb_get(pfStack_2548,(fdb_doc *)pfStack_2560);
        pfVar16 = pfStack_2560;
        if (handle != (fdb_kvs_handle *)0x1) break;
        pfVar16 = pfVar11;
        if (fVar3 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0010efc7;
LAB_0010eef0:
        pfStack_2570 = (fdb_kvs_handle *)0x10eefa;
        fdb_doc_free((fdb_doc *)pfStack_2560);
        handle = (fdb_kvs_handle *)&(handle->kvs_config).field_0x1;
        pfVar11 = pfVar16;
        if (handle == (fdb_kvs_handle *)0x3) {
          pfStack_2570 = (fdb_kvs_handle *)0x10ef19;
          fdb_get_file_info((fdb_file_handle *)auStack_2540._0_8_,&fStack_24f0);
          pfStack_2570 = (fdb_kvs_handle *)0x10ef28;
          iVar4 = strcmp("./compact_test2",fStack_24f0.filename);
          if (iVar4 != 0) {
            pfStack_2570 = (fdb_kvs_handle *)0x10ef36;
            auto_recover_compact_ok_test();
          }
          pfStack_2570 = (fdb_kvs_handle *)0x10ef40;
          fdb_kvs_close(pfStack_2548);
          pfStack_2570 = (fdb_kvs_handle *)0x10ef4a;
          fdb_close((fdb_file_handle *)auStack_2540._0_8_);
          lVar24 = 0;
          do {
            pfStack_2570 = (fdb_kvs_handle *)0x10ef56;
            fdb_doc_free(*(fdb_doc **)(auStack_2540 + lVar24 * 8 + 8));
            lVar24 = lVar24 + 1;
          } while (lVar24 != 3);
          pfStack_2570 = (fdb_kvs_handle *)0x10ef64;
          fdb_shutdown();
          pfStack_2570 = (fdb_kvs_handle *)0x10ef69;
          memleak_end();
          pcVar20 = "%s PASSED\n";
          if (auto_recover_compact_ok_test()::__test_pass != '\0') {
            pcVar20 = "%s FAILED\n";
          }
          pfStack_2570 = (fdb_kvs_handle *)0x10ef9a;
          fprintf(_stderr,pcVar20,"auto recovery after compaction test");
          return;
        }
      }
      if (fVar3 == FDB_RESULT_SUCCESS) {
        pbVar26 = pfStack_2560->staletree;
        pfVar8 = *(fdb_kvs_handle **)(auStack_2540 + (long)handle * 8 + 8);
        ptr_fhandle_00 = pfVar8->staletree;
        pfStack_2570 = (fdb_kvs_handle *)0x10eec9;
        iVar4 = bcmp(pbVar26,ptr_fhandle_00,(size_t)(pfStack_2560->kvs_config).custom_cmp);
        if (iVar4 == 0) {
          pbVar26 = (pfVar16->field_6).seqtree;
          ptr_fhandle_00 = (pfVar8->field_6).seqtree;
          pfStack_2570 = (fdb_kvs_handle *)0x10eee8;
          iVar4 = bcmp(pbVar26,ptr_fhandle_00,(size_t)(pfVar16->kvs_config).custom_cmp_param);
          if (iVar4 == 0) goto LAB_0010eef0;
          pfStack_2570 = (fdb_kvs_handle *)0x10efb7;
          auto_recover_compact_ok_test();
          pfVar11 = pfVar16;
          goto LAB_0010efb7;
        }
      }
      else {
LAB_0010efb7:
        pfVar16 = pfVar11;
        pfStack_2570 = (fdb_kvs_handle *)0x10efbc;
        auto_recover_compact_ok_test();
      }
      pfStack_2570 = (fdb_kvs_handle *)0x10efc7;
      auto_recover_compact_ok_test();
      pfVar11 = pfVar16;
LAB_0010efc7:
      pfStack_2570 = (fdb_kvs_handle *)0x10efcc;
      auto_recover_compact_ok_test();
      goto LAB_0010efcc;
    }
  }
  else {
LAB_0010efcc:
    pfStack_2570 = (fdb_kvs_handle *)0x10efd1;
    auto_recover_compact_ok_test();
LAB_0010efd1:
    pfStack_2570 = (fdb_kvs_handle *)0x10efd6;
    auto_recover_compact_ok_test();
  }
  pfStack_2570 = (fdb_kvs_handle *)unlink_after_compaction_test;
  auto_recover_compact_ok_test();
  pfStack_2ad8 = (fdb_kvs_handle *)0x10effb;
  ppfStack_2598 = ppfVar15;
  pfStack_2590 = handle;
  pfStack_2588 = pfVar11;
  pbStack_2580 = pbVar26;
  pbStack_2578 = ptr_fhandle_00;
  pfStack_2570 = pfVar8;
  gettimeofday(&tStack_2a48,(__timezone_ptr_t)0x0);
  pfStack_2ad8 = (fdb_kvs_handle *)0x10f000;
  memleak_start();
  pfStack_2ad8 = (fdb_kvs_handle *)0x10f00c;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_2ad8 = (fdb_kvs_handle *)0x10f01c;
  fdb_get_default_config();
  config = &fStack_2a38;
  pfStack_2ad8 = (fdb_kvs_handle *)0x10f02c;
  fdb_get_default_kvs_config();
  fStack_2690.buffercache_size = 0x1000000;
  fStack_2690.wal_threshold = 0x400;
  fStack_2690.flags = 1;
  fStack_2690.compaction_threshold = '\0';
  ppfVar30 = &pfStack_2ab0;
  pfStack_2ad8 = (fdb_kvs_handle *)0x10f05e;
  fdb_open((fdb_file_handle **)ppfVar30,"./compact_test1",&fStack_2690);
  ppfVar15 = &pfStack_2ab8;
  pfStack_2ad8 = (fdb_kvs_handle *)0x10f071;
  fdb_kvs_open_default((fdb_file_handle *)pfStack_2ab0,ppfVar15,config);
  pfStack_2ad8 = (fdb_kvs_handle *)0x10f087;
  fVar3 = fdb_set_log_callback(pfStack_2ab8,logCallbackFunc,"unlink_after_compaction_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    handle = (fdb_kvs_handle *)0x0;
    uVar12 = 0;
    do {
      pfStack_2ad8 = (fdb_kvs_handle *)0x10f0af;
      sprintf(auStack_2920 + 0x100,"key%d",uVar12 & 0xffffffff);
      pfStack_2ad8 = (fdb_kvs_handle *)0x10f0c7;
      sprintf(auStack_2920,"meta%d",uVar12 & 0xffffffff);
      pfStack_2ad8 = (fdb_kvs_handle *)0x10f0df;
      sprintf(acStack_2a20,"body%d",uVar12 & 0xffffffff);
      ppfVar30 = (fdb_doc **)((long)apfStack_2aa0 + (long)handle);
      pfStack_2ad8 = (fdb_kvs_handle *)0x10f0ef;
      pfVar11 = (fdb_kvs_handle *)strlen(auStack_2920 + 0x100);
      pfVar8 = (fdb_kvs_handle *)auStack_2920;
      pfStack_2ad8 = (fdb_kvs_handle *)0x10f102;
      config = (fdb_kvs_config *)strlen((char *)pfVar8);
      pfStack_2ad8 = (fdb_kvs_handle *)0x10f112;
      sVar5 = strlen(acStack_2a20);
      pfStack_2ad8 = (fdb_kvs_handle *)0x10f137;
      fdb_doc_create(ppfVar30,auStack_2920 + 0x100,(size_t)pfVar11,pfVar8,(size_t)config,
                     acStack_2a20,sVar5);
      pfStack_2ad8 = (fdb_kvs_handle *)0x10f146;
      fdb_set(pfStack_2ab8,apfStack_2aa0[uVar12]);
      uVar12 = uVar12 + 1;
      handle = (fdb_kvs_handle *)((long)handle + 8);
    } while (uVar12 != 10);
    pfStack_2ad8 = (fdb_kvs_handle *)0x10f166;
    fdb_commit((fdb_file_handle *)pfStack_2ab0,'\x01');
    pfStack_2ad8 = (fdb_kvs_handle *)0x10f17a;
    fVar3 = fdb_snapshot_open(pfStack_2ab8,&pfStack_2aa8,10);
    ppfVar15 = (fdb_kvs_handle **)0xa;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010f2df;
    pfStack_2ad8 = (fdb_kvs_handle *)0x10f193;
    fVar3 = fdb_compact((fdb_file_handle *)pfStack_2ab0,"./compact_test2");
    if (fVar3 == FDB_RESULT_SUCCESS) {
      config = (fdb_kvs_config *)0x0;
      do {
        pfStack_2ad8 = (fdb_kvs_handle *)0x10f1c7;
        fdb_doc_create((fdb_doc **)&pfStack_2ac0,apfStack_2aa0[(long)config]->key,
                       apfStack_2aa0[(long)config]->keylen,(void *)0x0,0,(void *)0x0,0);
        pfStack_2ad8 = (fdb_kvs_handle *)0x10f1d6;
        fVar3 = fdb_get(pfStack_2ab8,(fdb_doc *)pfStack_2ac0);
        if (fVar3 != FDB_RESULT_SUCCESS) {
          pfStack_2ad8 = (fdb_kvs_handle *)0x10f2d5;
          unlink_after_compaction_test();
          goto LAB_0010f2d5;
        }
        pfStack_2ad8 = (fdb_kvs_handle *)0x10f1e8;
        fdb_doc_free((fdb_doc *)pfStack_2ac0);
        config = (fdb_kvs_config *)&config->field_0x1;
      } while (config != (fdb_kvs_config *)0xa);
      pfStack_2ad8 = (fdb_kvs_handle *)0x10f205;
      iVar4 = stat("./compact_test1",(stat *)(auStack_2920 + 0x200));
      if (iVar4 == 0) {
        pfStack_2ad8 = (fdb_kvs_handle *)0x10f20e;
        unlink_after_compaction_test();
      }
      config = (fdb_kvs_config *)0x0;
      while( true ) {
        pfStack_2ad8 = (fdb_kvs_handle *)0x10f23a;
        fdb_doc_create((fdb_doc **)&pfStack_2ac0,apfStack_2aa0[(long)config]->key,
                       apfStack_2aa0[(long)config]->keylen,(void *)0x0,0,(void *)0x0,0);
        pfStack_2ad8 = (fdb_kvs_handle *)0x10f249;
        fVar3 = fdb_get(pfStack_2aa8,(fdb_doc *)pfStack_2ac0);
        if (fVar3 != FDB_RESULT_SUCCESS) break;
        pfStack_2ad8 = (fdb_kvs_handle *)0x10f25b;
        fdb_doc_free((fdb_doc *)pfStack_2ac0);
        config = (fdb_kvs_config *)&config->field_0x1;
        if (config == (fdb_kvs_config *)0xa) {
          pfStack_2ad8 = (fdb_kvs_handle *)0x10f26e;
          fdb_close((fdb_file_handle *)pfStack_2ab0);
          pfStack_2ad8 = (fdb_kvs_handle *)0x10f273;
          fdb_shutdown();
          lVar24 = 0;
          do {
            pfStack_2ad8 = (fdb_kvs_handle *)0x10f27f;
            fdb_doc_free(apfStack_2aa0[lVar24]);
            lVar24 = lVar24 + 1;
          } while (lVar24 != 10);
          pfStack_2ad8 = (fdb_kvs_handle *)0x10f28d;
          memleak_end();
          pcVar20 = "%s PASSED\n";
          if (unlink_after_compaction_test()::__test_pass != '\0') {
            pcVar20 = "%s FAILED\n";
          }
          pfStack_2ad8 = (fdb_kvs_handle *)0x10f2be;
          fprintf(_stderr,pcVar20,"unlink after compaction test");
          return;
        }
      }
LAB_0010f2d5:
      ppfVar15 = &pfStack_2ac0;
      pfStack_2ad8 = (fdb_kvs_handle *)0x10f2da;
      unlink_after_compaction_test();
      goto LAB_0010f2da;
    }
  }
  else {
LAB_0010f2da:
    pfStack_2ad8 = (fdb_kvs_handle *)0x10f2df;
    unlink_after_compaction_test();
LAB_0010f2df:
    pfStack_2ad8 = (fdb_kvs_handle *)0x10f2e4;
    unlink_after_compaction_test();
  }
  pfStack_2ad8 = (fdb_kvs_handle *)db_compact_overwrite;
  unlink_after_compaction_test();
  pfStack_3270 = (fdb_kvs_handle *)0x10f309;
  ppfStack_2b00 = ppfVar15;
  pfStack_2af8 = handle;
  pfStack_2af0 = pfVar11;
  pfStack_2ae8 = config;
  ppfStack_2ae0 = ppfVar30;
  pfStack_2ad8 = pfVar8;
  gettimeofday(&tStack_31e8,(__timezone_ptr_t)0x0);
  pfStack_3270 = (fdb_kvs_handle *)0x10f30e;
  memleak_start();
  pfStack_3270 = (fdb_kvs_handle *)0x10f31a;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_3270 = (fdb_kvs_handle *)0x10f32a;
  fdb_get_default_config();
  info = (fdb_kvs_info *)auStack_3230;
  pfStack_3270 = (fdb_kvs_handle *)0x10f337;
  fdb_get_default_kvs_config();
  fStack_2fe0.buffercache_size = 0x1000000;
  fStack_2fe0.wal_threshold = 0x400;
  fStack_2fe0.flags = 1;
  fStack_2fe0.compaction_threshold = '\0';
  _Var31._M_i = (__int_type_conflict)(auStack_3248 + 0x10);
  pfStack_3270 = (fdb_kvs_handle *)0x10f369;
  fdb_open((fdb_file_handle **)_Var31._M_i,"./compact_test1",&fStack_2fe0);
  ppfVar15 = (fdb_kvs_handle **)auStack_3248;
  pfStack_3270 = (fdb_kvs_handle *)0x10f37e;
  fdb_kvs_open((fdb_file_handle *)auStack_3248._16_8_,ppfVar15,(char *)0x0,(fdb_kvs_config *)info);
  pfStack_3270 = (fdb_kvs_handle *)0x10f394;
  pfVar16 = (fdb_kvs_handle *)auStack_3248._0_8_;
  fVar3 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_3248._0_8_,logCallbackFunc,"db_destroy_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    handle = (fdb_kvs_handle *)0x0;
    uVar12 = 0;
    do {
      pfStack_3270 = (fdb_kvs_handle *)0x10f3bc;
      sprintf(auStack_2ee8 + 0x100,"key%d",uVar12 & 0xffffffff);
      pfStack_3270 = (fdb_kvs_handle *)0x10f3d4;
      sprintf(auStack_2ee8,"meta%d",uVar12 & 0xffffffff);
      pfStack_3270 = (fdb_kvs_handle *)0x10f3ec;
      sprintf(acStack_31d8,"body%d",uVar12 & 0xffffffff);
      _Var31._M_i = (long)apfStack_30d8 + (long)handle;
      pfStack_3270 = (fdb_kvs_handle *)0x10f3ff;
      pfVar11 = (fdb_kvs_handle *)strlen(auStack_2ee8 + 0x100);
      pfVar8 = (fdb_kvs_handle *)auStack_2ee8;
      pfStack_3270 = (fdb_kvs_handle *)0x10f412;
      info = (fdb_kvs_info *)strlen((char *)pfVar8);
      pfStack_3270 = (fdb_kvs_handle *)0x10f422;
      sVar5 = strlen(acStack_31d8);
      pfStack_3270 = (fdb_kvs_handle *)0x10f447;
      fdb_doc_create((fdb_doc **)_Var31._M_i,auStack_2ee8 + 0x100,(size_t)pfVar11,pfVar8,
                     (size_t)info,acStack_31d8,sVar5);
      pfStack_3270 = (fdb_kvs_handle *)0x10f459;
      fdb_set((fdb_kvs_handle *)auStack_3248._0_8_,apfStack_30d8[uVar12]);
      uVar12 = uVar12 + 1;
      handle = (fdb_kvs_handle *)((long)handle + 8);
    } while (uVar12 != 0x1e);
    pfStack_3270 = (fdb_kvs_handle *)0x10f476;
    fdb_commit((fdb_file_handle *)auStack_3248._16_8_,'\0');
    pfStack_3270 = (fdb_kvs_handle *)0x10f492;
    fdb_open((fdb_file_handle **)(auStack_3248 + 8),"./compact_test1.1",&fStack_2fe0);
    ppfVar15 = (fdb_kvs_handle **)(auStack_3258 + 8);
    pfStack_3270 = (fdb_kvs_handle *)0x10f4a9;
    fdb_kvs_open((fdb_file_handle *)auStack_3248._8_8_,ppfVar15,(char *)0x0,
                 (fdb_kvs_config *)auStack_3230);
    pfStack_3270 = (fdb_kvs_handle *)0x10f4bf;
    pfVar16 = (fdb_kvs_handle *)auStack_3258._8_8_;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_3258._8_8_,logCallbackFunc,"db_destroy_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010f903;
    handle = (fdb_kvs_handle *)0x0;
    uVar12 = 0;
    do {
      pfStack_3270 = (fdb_kvs_handle *)0x10f4e7;
      sprintf(auStack_2ee8 + 0x100,"k2ey%d",uVar12 & 0xffffffff);
      pfStack_3270 = (fdb_kvs_handle *)0x10f4ff;
      sprintf(auStack_2ee8,"m2eta%d",uVar12 & 0xffffffff);
      pfStack_3270 = (fdb_kvs_handle *)0x10f517;
      sprintf(acStack_31d8,"b2ody%d",uVar12 & 0xffffffff);
      _Var31._M_i = (__int_type_conflict)(auStack_2ee8 + (long)handle + 0x200);
      pfStack_3270 = (fdb_kvs_handle *)0x10f52a;
      pfVar11 = (fdb_kvs_handle *)strlen(auStack_2ee8 + 0x100);
      pfVar8 = (fdb_kvs_handle *)auStack_2ee8;
      pfStack_3270 = (fdb_kvs_handle *)0x10f53d;
      info = (fdb_kvs_info *)strlen((char *)pfVar8);
      pfStack_3270 = (fdb_kvs_handle *)0x10f54d;
      sVar5 = strlen(acStack_31d8);
      pfStack_3270 = (fdb_kvs_handle *)0x10f572;
      fdb_doc_create((fdb_doc **)_Var31._M_i,auStack_2ee8 + 0x100,(size_t)pfVar11,pfVar8,
                     (size_t)info,acStack_31d8,sVar5);
      pfStack_3270 = (fdb_kvs_handle *)0x10f584;
      fdb_set((fdb_kvs_handle *)auStack_3258._8_8_,(fdb_doc *)auStack_2bf8[uVar12 - 0x1e]);
      uVar12 = uVar12 + 1;
      handle = (fdb_kvs_handle *)((long)handle + 8);
    } while (uVar12 != 0x3c);
    pfStack_3270 = (fdb_kvs_handle *)0x10f5a1;
    fdb_commit((fdb_file_handle *)auStack_3248._8_8_,'\0');
    pfStack_3270 = (fdb_kvs_handle *)0x10f5b0;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_3258._8_8_,(fdb_kvs_info *)(auStack_3230 + 0x18));
    ppfVar15 = apfStack_3210;
    if (apfStack_3210[0] != (fdb_kvs_handle *)0x3c) {
      pfStack_3270 = (fdb_kvs_handle *)0x10f5c3;
      db_compact_overwrite();
    }
    pfStack_3270 = (fdb_kvs_handle *)0x10f5cd;
    fdb_kvs_close((fdb_kvs_handle *)auStack_3258._8_8_);
    pfStack_3270 = (fdb_kvs_handle *)0x10f5d7;
    fdb_close((fdb_file_handle *)auStack_3248._8_8_);
    pfStack_3270 = (fdb_kvs_handle *)0x10f5e3;
    pfVar16 = (fdb_kvs_handle *)auStack_3248._16_8_;
    fVar3 = fdb_compact((fdb_file_handle *)auStack_3248._16_8_,(char *)0x0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010f908;
    info = (fdb_kvs_info *)auStack_3248;
    pfStack_3270 = (fdb_kvs_handle *)0x10f5f8;
    fdb_kvs_close((fdb_kvs_handle *)auStack_3248._0_8_);
    _Var31._M_i = (__int_type_conflict)(auStack_3248 + 0x10);
    pfStack_3270 = (fdb_kvs_handle *)0x10f605;
    fdb_close((fdb_file_handle *)auStack_3248._16_8_);
    pfStack_3270 = (fdb_kvs_handle *)0x10f61c;
    fdb_open((fdb_file_handle **)_Var31._M_i,"./compact_test1",&fStack_2fe0);
    pfStack_3270 = (fdb_kvs_handle *)0x10f62e;
    fdb_kvs_open((fdb_file_handle *)auStack_3248._16_8_,(fdb_kvs_handle **)info,(char *)0x0,
                 (fdb_kvs_config *)auStack_3230);
    pfStack_3270 = (fdb_kvs_handle *)0x10f644;
    pfVar16 = (fdb_kvs_handle *)auStack_3248._0_8_;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_3248._0_8_,logCallbackFunc,"db_destroy_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010f90d;
    handle = (fdb_kvs_handle *)0x0;
    info = (fdb_kvs_info *)auStack_3258;
    do {
      pfStack_3270 = (fdb_kvs_handle *)0x10f67b;
      fdb_doc_create((fdb_doc **)info,(void *)(*(size_t **)((long)apfStack_30d8 + (long)handle))[4],
                     **(size_t **)((long)apfStack_30d8 + (long)handle),(void *)0x0,0,(void *)0x0,0);
      pfStack_3270 = (fdb_kvs_handle *)0x10f68a;
      pfVar16 = (fdb_kvs_handle *)auStack_3248._0_8_;
      fVar3 = fdb_get((fdb_kvs_handle *)auStack_3248._0_8_,(fdb_doc *)auStack_3258._0_8_);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_3270 = (fdb_kvs_handle *)0x10f8f9;
        db_compact_overwrite();
        goto LAB_0010f8f9;
      }
      _Var31._M_i = (long)apfStack_30d8 + (long)handle;
      pfStack_3270 = (fdb_kvs_handle *)0x10f6b6;
      iVar4 = bcmp(*(btree **)(auStack_3258._0_8_ + 0x38),(*(fdb_doc **)_Var31._M_i)->meta,
                   (size_t)((fdb_kvs_config *)auStack_3258._0_8_)->custom_cmp);
      if (iVar4 != 0) {
        pfStack_3270 = (fdb_kvs_handle *)0x10f6ff;
        db_compact_overwrite();
      }
      pfStack_3270 = (fdb_kvs_handle *)0x10f6d3;
      iVar4 = bcmp(((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_3258._0_8_ + 0x40))->
                   seqtree,(*(fdb_doc **)_Var31._M_i)->body,
                   (size_t)((fdb_kvs_config *)auStack_3258._0_8_)->custom_cmp_param);
      if (iVar4 != 0) {
        pfStack_3270 = (fdb_kvs_handle *)0x10f70c;
        db_compact_overwrite();
      }
      pfStack_3270 = (fdb_kvs_handle *)0x10f6e1;
      fdb_doc_free((fdb_doc *)auStack_3258._0_8_);
      handle = (fdb_kvs_handle *)&(handle->kvs_config).custom_cmp;
    } while (handle != (fdb_kvs_handle *)0xf0);
    pfStack_3270 = (fdb_kvs_handle *)0x10f72a;
    fdb_open((fdb_file_handle **)(auStack_3248 + 8),"./compact_test1.1",&fStack_2fe0);
    info = (fdb_kvs_info *)(auStack_3258 + 8);
    pfStack_3270 = (fdb_kvs_handle *)0x10f741;
    fdb_kvs_open((fdb_file_handle *)auStack_3248._8_8_,(fdb_kvs_handle **)info,(char *)0x0,
                 (fdb_kvs_config *)auStack_3230);
    pfStack_3270 = (fdb_kvs_handle *)0x10f757;
    pfVar16 = (fdb_kvs_handle *)auStack_3258._8_8_;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_3258._8_8_,logCallbackFunc,"db_destroy_test");
    if (fVar3 == FDB_RESULT_SUCCESS) {
      info = (fdb_kvs_info *)(auStack_3230 + 0x18);
      pfStack_3270 = (fdb_kvs_handle *)0x10f771;
      fdb_get_kvs_info((fdb_kvs_handle *)auStack_3258._8_8_,info);
      if (apfStack_3210[0] != (fdb_kvs_handle *)0x3c) {
        pfStack_3270 = (fdb_kvs_handle *)0x10f780;
        db_compact_overwrite();
      }
      _Var31._M_i = 0;
      ppfVar15 = (fdb_kvs_handle **)auStack_3258;
      while( true ) {
        pfStack_3270 = (fdb_kvs_handle *)0x10f7af;
        fdb_doc_create((fdb_doc **)ppfVar15,
                       (void *)(*(size_t **)(auStack_2ee8 + 0x200 + _Var31._M_i))[4],
                       **(size_t **)(auStack_2ee8 + 0x200 + _Var31._M_i),(void *)0x0,0,(void *)0x0,0
                      );
        pfStack_3270 = (fdb_kvs_handle *)0x10f7be;
        pfVar16 = (fdb_kvs_handle *)auStack_3258._8_8_;
        fVar3 = fdb_get((fdb_kvs_handle *)auStack_3258._8_8_,(fdb_doc *)auStack_3258._0_8_);
        if (fVar3 != FDB_RESULT_SUCCESS) break;
        info = (fdb_kvs_info *)(auStack_2ee8 + 0x200 + _Var31._M_i);
        pfStack_3270 = (fdb_kvs_handle *)0x10f7ea;
        iVar4 = bcmp(*(btree **)(auStack_3258._0_8_ + 0x38),*(void **)(info->name + 0x38),
                     (size_t)((fdb_kvs_config *)auStack_3258._0_8_)->custom_cmp);
        if (iVar4 != 0) {
          pfStack_3270 = (fdb_kvs_handle *)0x10f833;
          db_compact_overwrite();
        }
        pfStack_3270 = (fdb_kvs_handle *)0x10f807;
        iVar4 = bcmp(((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_3258._0_8_ + 0x40))
                     ->seqtree,*(void **)(info->name + 0x40),
                     (size_t)((fdb_kvs_config *)auStack_3258._0_8_)->custom_cmp_param);
        if (iVar4 != 0) {
          pfStack_3270 = (fdb_kvs_handle *)0x10f840;
          db_compact_overwrite();
        }
        pfStack_3270 = (fdb_kvs_handle *)0x10f815;
        fdb_doc_free((fdb_doc *)auStack_3258._0_8_);
        _Var31._M_i = _Var31._M_i + 8;
        if ((fdb_doc **)_Var31._M_i == (fdb_doc **)0x1e0) {
          lVar24 = 0;
          do {
            pfStack_3270 = (fdb_kvs_handle *)0x10f851;
            fdb_doc_free(apfStack_30d8[lVar24]);
            pfStack_3270 = (fdb_kvs_handle *)0x10f85e;
            fdb_doc_free((fdb_doc *)auStack_2bf8[lVar24 + -0x1e]);
            lVar24 = lVar24 + 1;
          } while (lVar24 != 0x1e);
          lVar24 = 0;
          do {
            pfStack_3270 = (fdb_kvs_handle *)0x10f876;
            fdb_doc_free((fdb_doc *)auStack_2bf8[lVar24]);
            lVar24 = lVar24 + 1;
          } while (lVar24 != 0x1e);
          pfStack_3270 = (fdb_kvs_handle *)0x10f889;
          fdb_kvs_close((fdb_kvs_handle *)auStack_3248._0_8_);
          pfStack_3270 = (fdb_kvs_handle *)0x10f893;
          fdb_close((fdb_file_handle *)auStack_3248._16_8_);
          pfStack_3270 = (fdb_kvs_handle *)0x10f89d;
          fdb_kvs_close((fdb_kvs_handle *)auStack_3258._8_8_);
          pfStack_3270 = (fdb_kvs_handle *)0x10f8a7;
          fdb_close((fdb_file_handle *)auStack_3248._8_8_);
          pfStack_3270 = (fdb_kvs_handle *)0x10f8ac;
          fdb_shutdown();
          pfStack_3270 = (fdb_kvs_handle *)0x10f8b1;
          memleak_end();
          pcVar20 = "%s PASSED\n";
          if (db_compact_overwrite()::__test_pass != '\0') {
            pcVar20 = "%s FAILED\n";
          }
          pfStack_3270 = (fdb_kvs_handle *)0x10f8e2;
          fprintf(_stderr,pcVar20,"compact overwrite");
          return;
        }
      }
LAB_0010f8f9:
      pfStack_3270 = (fdb_kvs_handle *)0x10f8fe;
      db_compact_overwrite();
      goto LAB_0010f8fe;
    }
  }
  else {
LAB_0010f8fe:
    pfStack_3270 = (fdb_kvs_handle *)0x10f903;
    db_compact_overwrite();
LAB_0010f903:
    pfStack_3270 = (fdb_kvs_handle *)0x10f908;
    db_compact_overwrite();
LAB_0010f908:
    pfStack_3270 = (fdb_kvs_handle *)0x10f90d;
    db_compact_overwrite();
LAB_0010f90d:
    pfStack_3270 = (fdb_kvs_handle *)0x10f912;
    db_compact_overwrite();
  }
  pfStack_3270 = (fdb_kvs_handle *)db_compact_during_doc_delete;
  db_compact_overwrite();
  pfStack_3a48 = (fdb_kvs_handle *)0x10f937;
  ppfStack_3298 = ppfVar15;
  pfStack_3290 = handle;
  pfStack_3288 = pfVar11;
  pfStack_3280 = info;
  ppfStack_3278 = (fdb_doc **)_Var31._M_i;
  pfStack_3270 = pfVar8;
  gettimeofday(&tStack_39c8,(__timezone_ptr_t)0x0);
  pfStack_3a48 = (fdb_kvs_handle *)0x10f93c;
  memleak_start();
  pfStack_3a48 = (fdb_kvs_handle *)0x10f946;
  fdb_get_default_kvs_config();
  pfVar19 = (fdb_kvs_handle *)auStack_39b8;
  pfStack_3a48 = (fdb_kvs_handle *)0x10f956;
  fdb_get_default_config();
  auStack_39b8._8_8_ = (list *)0x0;
  auStack_39b8._16_8_ = (list *)0x400;
  auStack_39b8[0x2f] = '\0';
  if (pfVar16 == (fdb_kvs_handle *)0x0) {
    pfStack_3a48 = (fdb_kvs_handle *)0x10f980;
    system("rm -rf  compact_test* > errorlog.txt");
    ptr_fhandle = (fdb_kvs_handle *)&pfStack_3a30;
    pfStack_3a48 = (fdb_kvs_handle *)0x10f999;
    fVar3 = fdb_open((fdb_file_handle **)ptr_fhandle,"./compact_test1",(fdb_config *)auStack_39b8);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      pfStack_3a48 = (fdb_kvs_handle *)0x10f9b5;
      ptr_fhandle = pfStack_3a30;
      fVar3 = fdb_kvs_open_default((fdb_file_handle *)pfStack_3a30,&pfStack_3a28,&fStack_3a10);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010fc6b;
      lVar24 = 0;
      uVar12 = 0;
      do {
        pfStack_3a48 = (fdb_kvs_handle *)0x10f9dd;
        sprintf(acStack_36c0,"key%d",uVar12 & 0xffffffff);
        pfStack_3a48 = (fdb_kvs_handle *)0x10f9f5;
        sprintf(auStack_39b8 + 0x1f8,"meta%d",uVar12 & 0xffffffff);
        pfStack_3a48 = (fdb_kvs_handle *)0x10fa0d;
        sprintf(auStack_39b8 + 0xf8,"body%d",uVar12 & 0xffffffff);
        pfStack_3a48 = (fdb_kvs_handle *)0x10fa20;
        pfVar11 = (fdb_kvs_handle *)strlen(acStack_36c0);
        pfVar8 = (fdb_kvs_handle *)(auStack_39b8 + 0x1f8);
        pfStack_3a48 = (fdb_kvs_handle *)0x10fa33;
        sVar5 = strlen((char *)pfVar8);
        pfStack_3a48 = (fdb_kvs_handle *)0x10fa43;
        sVar6 = strlen(auStack_39b8 + 0xf8);
        pfStack_3a48 = (fdb_kvs_handle *)0x10fa68;
        fdb_doc_create((fdb_doc **)((long)apfStack_35c0 + lVar24),acStack_36c0,(size_t)pfVar11,
                       pfVar8,sVar5,auStack_39b8 + 0xf8,sVar6);
        pfStack_3a48 = (fdb_kvs_handle *)0x10fa7a;
        fdb_set(pfStack_3a28,apfStack_35c0[uVar12]);
        uVar12 = uVar12 + 1;
        lVar24 = lVar24 + 8;
      } while (uVar12 != 100);
      pfStack_3a48 = (fdb_kvs_handle *)0x10fa97;
      fdb_commit((fdb_file_handle *)pfStack_3a30,'\0');
      pfStack_3a48 = (fdb_kvs_handle *)0x10faa6;
      fdb_get_kvs_info(pfStack_3a28,(fdb_kvs_info *)auStack_39f8);
      pfVar16 = (fdb_kvs_handle *)(auStack_39f8 + 0x10);
      if ((filemgr *)auStack_39f8._16_8_ != (filemgr *)0x64) {
        pfStack_3a48 = (fdb_kvs_handle *)0x10fab9;
        db_compact_during_doc_delete();
      }
      lVar24 = 0;
      _Var31._M_i = (__int_type_conflict)&pfStack_3a20;
      do {
        pfStack_3a48 = (fdb_kvs_handle *)0x10fada;
        fdb_del(pfStack_3a28,apfStack_35c0[lVar24]);
        if (lVar24 == 0x32) {
          pfStack_3a48 = (fdb_kvs_handle *)0x10faf2;
          pthread_create((pthread_t *)_Var31._M_i,(pthread_attr_t *)0x0,db_compact_during_doc_delete
                         ,pfStack_3a30);
        }
        lVar24 = lVar24 + 1;
      } while (lVar24 != 100);
      pfStack_3a48 = (fdb_kvs_handle *)0x10fb0a;
      pthread_join((pthread_t)pfStack_3a20,&pvStack_3a18);
      pfStack_3a48 = (fdb_kvs_handle *)0x10fb19;
      fdb_commit((fdb_file_handle *)pfStack_3a30,'\x01');
      pfStack_3a48 = (fdb_kvs_handle *)0x10fb2b;
      fdb_get_kvs_info(pfStack_3a28,(fdb_kvs_info *)auStack_39f8);
      if ((filemgr *)auStack_39f8._16_8_ != (filemgr *)0x0) {
        pfStack_3a48 = (fdb_kvs_handle *)0x10fb3a;
        db_compact_during_doc_delete();
      }
      pfStack_3a48 = (fdb_kvs_handle *)0x10fb44;
      fdb_kvs_close(pfStack_3a28);
      pfVar19 = (fdb_kvs_handle *)&pfStack_3a30;
      pfStack_3a48 = (fdb_kvs_handle *)0x10fb51;
      fdb_close((fdb_file_handle *)pfStack_3a30);
      pfStack_3a48 = (fdb_kvs_handle *)0x10fb68;
      ptr_fhandle = pfVar19;
      fVar3 = fdb_open((fdb_file_handle **)pfVar19,"./compact_test1",(fdb_config *)auStack_39b8);
      handle = (fdb_kvs_handle *)0x64;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010fc70;
      pfStack_3a48 = (fdb_kvs_handle *)0x10fb84;
      ptr_fhandle = pfStack_3a30;
      fVar3 = fdb_kvs_open_default((fdb_file_handle *)pfStack_3a30,&pfStack_3a28,&fStack_3a10);
      if (fVar3 == FDB_RESULT_SUCCESS) {
        pfStack_3a48 = (fdb_kvs_handle *)0x10fb9e;
        fdb_get_kvs_info(pfStack_3a28,(fdb_kvs_info *)auStack_39f8);
        if ((filemgr *)auStack_39f8._16_8_ != (filemgr *)0x0) {
          pfStack_3a48 = (fdb_kvs_handle *)0x10fbad;
          db_compact_during_doc_delete();
        }
        lVar24 = 0;
        do {
          pfStack_3a48 = (fdb_kvs_handle *)0x10fbbc;
          fdb_doc_free(apfStack_35c0[lVar24]);
          lVar24 = lVar24 + 1;
        } while (lVar24 != 100);
        pfStack_3a48 = (fdb_kvs_handle *)0x10fbcf;
        fdb_kvs_close(pfStack_3a28);
        pfStack_3a48 = (fdb_kvs_handle *)0x10fbd9;
        fdb_close((fdb_file_handle *)pfStack_3a30);
        pfStack_3a48 = (fdb_kvs_handle *)0x10fbde;
        fdb_shutdown();
        pfStack_3a48 = (fdb_kvs_handle *)0x10fbe3;
        memleak_end();
        pcVar20 = "%s PASSED\n";
        if (db_compact_during_doc_delete(void*)::__test_pass != '\0') {
          pcVar20 = "%s FAILED\n";
        }
        pfStack_3a48 = (fdb_kvs_handle *)0x10fc14;
        fprintf(_stderr,pcVar20,"multi thread client shutdown");
        return;
      }
    }
    else {
      pfStack_3a48 = (fdb_kvs_handle *)0x10fc6b;
      db_compact_during_doc_delete();
LAB_0010fc6b:
      pfStack_3a48 = (fdb_kvs_handle *)0x10fc70;
      db_compact_during_doc_delete();
LAB_0010fc70:
      pfStack_3a48 = (fdb_kvs_handle *)0x10fc75;
      db_compact_during_doc_delete();
    }
    pfStack_3a48 = (fdb_kvs_handle *)0x10fc7a;
    db_compact_during_doc_delete();
LAB_0010fc7a:
    pfStack_3a48 = (fdb_kvs_handle *)0x10fc7f;
    db_compact_during_doc_delete();
  }
  else {
    ptr_fhandle = (fdb_kvs_handle *)&pfStack_3a30;
    pfStack_3a48 = (fdb_kvs_handle *)0x10fc41;
    fVar3 = fdb_open((fdb_file_handle **)ptr_fhandle,"./compact_test1",(fdb_config *)auStack_39b8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010fc7a;
    pfStack_3a48 = (fdb_kvs_handle *)0x10fc51;
    ptr_fhandle = pfStack_3a30;
    fVar3 = fdb_compact((fdb_file_handle *)pfStack_3a30,(char *)0x0);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      pfStack_3a48 = (fdb_kvs_handle *)0x10fc5f;
      fdb_close((fdb_file_handle *)pfStack_3a30);
      pfStack_3a48 = (fdb_kvs_handle *)0x10fc66;
      pthread_exit((void *)0x0);
    }
  }
  pfStack_3a48 = (fdb_kvs_handle *)compaction_daemon_test;
  db_compact_during_doc_delete();
  pcVar17 = (char *)0x0;
  pfStack_17800 = (fdb_kvs_handle *)0x10fcab;
  pfStack_177b8 = ptr_fhandle;
  pfStack_3a70 = pfVar16;
  pfStack_3a68 = handle;
  pfStack_3a60 = pfVar11;
  pfStack_3a58 = pfVar19;
  ppfStack_3a50 = (fdb_doc **)_Var31._M_i;
  pfStack_3a48 = pfVar8;
  gettimeofday(&tStack_17650,(__timezone_ptr_t)0x0);
  pfStack_17800 = (fdb_kvs_handle *)0x10fcb0;
  memleak_start();
  pfStack_17800 = (fdb_kvs_handle *)0x10fcbc;
  system("rm -rf  compact_test* > errorlog.txt");
  pfVar16 = (fdb_kvs_handle *)auStack_17758;
  pfStack_17800 = (fdb_kvs_handle *)0x10fccc;
  fdb_get_default_config();
  pfStack_17800 = (fdb_kvs_handle *)0x10fcd6;
  fdb_get_default_kvs_config();
  auStack_17758._8_8_ = (kvs_ops_stat *)0x0;
  auStack_17758._16_8_ = (fdb_file_handle *)0x400;
  auStack_17758._36_4_ = 1;
  auStack_17758._46_2_ = 0x1e01;
  auStack_17758._56_8_ = (docio_handle *)0x1;
  auStack_17758._120_8_ = 0;
  pcVar20 = auStack_177e8;
  pfStack_17800 = (fdb_kvs_handle *)0x10fd11;
  fVar3 = fdb_open((fdb_file_handle **)pcVar20,"compact_test",(fdb_config *)pfVar16);
  if (fVar3 == FDB_RESULT_INVALID_CONFIG) {
    auStack_17758._120_8_ = 4;
    pfStack_17800 = (fdb_kvs_handle *)0x10fd3e;
    fdb_open((fdb_file_handle **)auStack_177e8,"compact_test",(fdb_config *)auStack_17758);
    pfVar16 = (fdb_kvs_handle *)(auStack_177e8 + 8);
    pfStack_17800 = (fdb_kvs_handle *)0x10fd53;
    fdb_kvs_open_default
              ((fdb_file_handle *)auStack_177e8._0_8_,(fdb_kvs_handle **)pfVar16,&fStack_177b0);
    pfStack_17800 = (fdb_kvs_handle *)0x10fd69;
    pcVar20 = (char *)auStack_177e8._8_8_;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_177e8._8_8_,logCallbackFunc,
                       "compaction_daemon_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110810;
    pfStack_17800 = (fdb_kvs_handle *)0x10fd7d;
    puts("Initialize..");
    pcVar17 = (char *)0x0;
    uVar12 = 0;
    do {
      pfStack_17800 = (fdb_kvs_handle *)0x10fd9e;
      sprintf((char *)apfStack_175f8,"key%04d",uVar12 & 0xffffffff);
      pfStack_17800 = (fdb_kvs_handle *)0x10fdba;
      sprintf(acStack_174f8,"meta%04d",uVar12 & 0xffffffff);
      pfStack_17800 = (fdb_kvs_handle *)0x10fdd6;
      sprintf(acStack_173f8,"body%04d",uVar12 & 0xffffffff);
      pfVar8 = (fdb_kvs_handle *)(&afStack_172f8[0].kvs_config.create_if_missing + (long)pcVar17);
      pfStack_17800 = (fdb_kvs_handle *)0x10fde9;
      sVar5 = strlen((char *)apfStack_175f8);
      _Var31._M_i = sVar5 + 1;
      pfStack_17800 = (fdb_kvs_handle *)0x10fdf5;
      sVar5 = strlen(acStack_174f8);
      pfVar11 = (fdb_kvs_handle *)(sVar5 + 1);
      pfStack_17800 = (fdb_kvs_handle *)0x10fe01;
      sVar5 = strlen(acStack_173f8);
      pfStack_17800 = (fdb_kvs_handle *)0x10fe29;
      fdb_doc_create((fdb_doc **)pfVar8,apfStack_175f8,_Var31._M_i,acStack_174f8,(size_t)pfVar11,
                     acStack_173f8,sVar5 + 1);
      pfStack_17800 = (fdb_kvs_handle *)0x10fe3b;
      fdb_set((fdb_kvs_handle *)auStack_177e8._8_8_,
              *(fdb_doc **)(&afStack_172f8[0].kvs_config.create_if_missing + uVar12 * 8));
      uVar12 = uVar12 + 1;
      pcVar17 = (char *)((long)pcVar17 + 8);
    } while (uVar12 != 10000);
    pfVar16 = (fdb_kvs_handle *)auStack_177e8;
    pfStack_17800 = (fdb_kvs_handle *)0x10fe5e;
    fdb_commit((fdb_file_handle *)auStack_177e8._0_8_,'\0');
    pfStack_17800 = (fdb_kvs_handle *)0x10fe66;
    fdb_close((fdb_file_handle *)auStack_177e8._0_8_);
    pfStack_17800 = (fdb_kvs_handle *)0x10fe7d;
    pcVar20 = (char *)pfVar16;
    fVar3 = fdb_open((fdb_file_handle **)pfVar16,"compact_test",(fdb_config *)auStack_17758);
    handle = (fdb_kvs_handle *)0x2710;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110815;
    pfStack_17800 = (fdb_kvs_handle *)0x10fe99;
    pcVar20 = (char *)auStack_177e8._0_8_;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_177e8._0_8_,(fdb_kvs_handle **)(auStack_177e8 + 8)
                       ,&fStack_177b0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011081a;
    pfStack_17800 = (fdb_kvs_handle *)0x10feb9;
    pcVar20 = (char *)auStack_177e8._8_8_;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_177e8._8_8_,logCallbackFunc,
                       "compaction_daemon_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011081f;
    pfVar16 = (fdb_kvs_handle *)&_Stack_17640;
    pfStack_17800 = (fdb_kvs_handle *)0x10fed6;
    fdb_get_file_info((fdb_file_handle *)auStack_177e8._0_8_,(fdb_file_info *)pfVar16);
    pfStack_17800 = (fdb_kvs_handle *)0x10fee5;
    iVar4 = strcmp((char *)_Stack_17640._M_i,"compact_test");
    if (iVar4 != 0) {
      pfStack_17800 = (fdb_kvs_handle *)0x10fef6;
      compaction_daemon_test();
    }
    pcVar17 = "key%04d";
    _Var31._M_i = (__int_type_conflict)apfStack_175f8;
    pfVar11 = (fdb_kvs_handle *)0x0;
    pfVar19 = pfVar8;
    do {
      pfStack_17800 = (fdb_kvs_handle *)0x10ff18;
      sprintf((char *)_Var31._M_i,"key%04d",(ulong)pfVar11 & 0xffffffff);
      pfStack_17800 = (fdb_kvs_handle *)0x10ff20;
      sVar5 = strlen((char *)_Var31._M_i);
      pfStack_17800 = (fdb_kvs_handle *)0x10ff41;
      fdb_doc_create((fdb_doc **)&pfStack_177d0,(void *)_Var31._M_i,sVar5 + 1,(void *)0x0,0,
                     (void *)0x0,0);
      pfStack_17800 = (fdb_kvs_handle *)0x10ff50;
      fVar3 = fdb_get((fdb_kvs_handle *)auStack_177e8._8_8_,(fdb_doc *)pfStack_177d0);
      pfVar8 = pfStack_177d0;
      if (fVar3 != FDB_RESULT_SUCCESS) {
LAB_001107e6:
        pfStack_17800 = (fdb_kvs_handle *)0x1107eb;
        compaction_daemon_test();
        goto LAB_001107eb;
      }
      pfVar16 = (fdb_kvs_handle *)(pfStack_177d0->field_6).seqtree;
      handle = *(fdb_kvs_handle **)
                (*(long *)(&afStack_172f8[0].kvs_config.create_if_missing + (long)pfVar11 * 8) +
                0x40);
      pfStack_17800 = (fdb_kvs_handle *)0x10ff7c;
      iVar4 = bcmp(pfVar16,handle,(size_t)(pfStack_177d0->kvs_config).custom_cmp_param);
      pfVar19 = pfVar8;
      if (iVar4 != 0) {
        pfStack_17800 = (fdb_kvs_handle *)0x1107e6;
        compaction_daemon_test();
        goto LAB_001107e6;
      }
      pfStack_17800 = (fdb_kvs_handle *)0x10ff8c;
      fdb_doc_free((fdb_doc *)pfVar8);
      pfVar11 = (fdb_kvs_handle *)&(pfVar11->kvs_config).field_0x1;
    } while (pfVar11 != (fdb_kvs_handle *)0x2710);
    pfStack_17800 = (fdb_kvs_handle *)0x10ffb0;
    pcVar20 = (char *)auStack_177e8._8_8_;
    fVar3 = fdb_snapshot_open((fdb_kvs_handle *)auStack_177e8._8_8_,
                              (fdb_kvs_handle **)&pfStack_17790,10000);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110824;
    pfStack_17800 = (fdb_kvs_handle *)0x10ffc2;
    fdb_kvs_close((fdb_kvs_handle *)pfStack_17790);
    pfVar16 = (fdb_kvs_handle *)auStack_177e8;
    pfStack_17800 = (fdb_kvs_handle *)0x10ffcf;
    fdb_close((fdb_file_handle *)auStack_177e8._0_8_);
    pfStack_17800 = (fdb_kvs_handle *)0x10ffdb;
    system("rm -rf  compact_test.meta > errorlog.txt");
    pfStack_17800 = (fdb_kvs_handle *)0x10fff2;
    pcVar20 = (char *)pfVar16;
    fVar3 = fdb_open((fdb_file_handle **)pfVar16,"compact_test",(fdb_config *)auStack_17758);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110829;
    pfStack_17800 = (fdb_kvs_handle *)0x11000e;
    pcVar20 = (char *)auStack_177e8._0_8_;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_177e8._0_8_,(fdb_kvs_handle **)(auStack_177e8 + 8)
                       ,&fStack_177b0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011082e;
    pfStack_17800 = (fdb_kvs_handle *)0x11002e;
    pcVar20 = (char *)auStack_177e8._8_8_;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_177e8._8_8_,logCallbackFunc,
                       "compaction_daemon_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110833;
    pcVar17 = "key%04d";
    _Var31._M_i = (__int_type_conflict)apfStack_175f8;
    pfVar11 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_17800 = (fdb_kvs_handle *)0x110058;
      sprintf((char *)_Var31._M_i,"key%04d",(ulong)pfVar11 & 0xffffffff);
      pfStack_17800 = (fdb_kvs_handle *)0x110060;
      sVar5 = strlen((char *)_Var31._M_i);
      pfStack_17800 = (fdb_kvs_handle *)0x110081;
      fdb_doc_create((fdb_doc **)&pfStack_177d0,(void *)_Var31._M_i,sVar5 + 1,(void *)0x0,0,
                     (void *)0x0,0);
      pfStack_17800 = (fdb_kvs_handle *)0x110090;
      fVar3 = fdb_get((fdb_kvs_handle *)auStack_177e8._8_8_,(fdb_doc *)pfStack_177d0);
      pfVar19 = pfStack_177d0;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001107f6;
      pfVar16 = (fdb_kvs_handle *)(pfStack_177d0->field_6).seqtree;
      handle = *(fdb_kvs_handle **)
                (*(long *)(&afStack_172f8[0].kvs_config.create_if_missing + (long)pfVar11 * 8) +
                0x40);
      pfStack_17800 = (fdb_kvs_handle *)0x1100bc;
      iVar4 = bcmp(pfVar16,handle,(size_t)(pfStack_177d0->kvs_config).custom_cmp_param);
      if (iVar4 != 0) goto LAB_001107eb;
      pfStack_17800 = (fdb_kvs_handle *)0x1100cc;
      fdb_doc_free((fdb_doc *)pfVar19);
      pfVar11 = (fdb_kvs_handle *)&(pfVar11->kvs_config).field_0x1;
      pfVar8 = pfVar19;
    } while (pfVar11 != (fdb_kvs_handle *)0x2710);
    pfVar16 = (fdb_kvs_handle *)auStack_177e8;
    pfStack_17800 = (fdb_kvs_handle *)0x1100e9;
    fdb_close((fdb_file_handle *)auStack_177e8._0_8_);
    pfStack_17800 = (fdb_kvs_handle *)0x1100f5;
    system("mv  compact_test.0 compact_test.23 > errorlog.txt");
    pfStack_17800 = (fdb_kvs_handle *)0x11010c;
    pcVar20 = (char *)pfVar16;
    fVar3 = fdb_open((fdb_file_handle **)pfVar16,"compact_test",(fdb_config *)auStack_17758);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110838;
    pfStack_17800 = (fdb_kvs_handle *)0x110128;
    pcVar20 = (char *)auStack_177e8._0_8_;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_177e8._0_8_,(fdb_kvs_handle **)(auStack_177e8 + 8)
                       ,&fStack_177b0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011083d;
    pfStack_17800 = (fdb_kvs_handle *)0x110148;
    pcVar20 = (char *)auStack_177e8._8_8_;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_177e8._8_8_,logCallbackFunc,
                       "compaction_daemon_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110842;
    pcVar17 = "key%04d";
    _Var31._M_i = (__int_type_conflict)apfStack_175f8;
    pfVar11 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_17800 = (fdb_kvs_handle *)0x110172;
      sprintf((char *)_Var31._M_i,"key%04d",(ulong)pfVar11 & 0xffffffff);
      pfStack_17800 = (fdb_kvs_handle *)0x11017a;
      sVar5 = strlen((char *)_Var31._M_i);
      pfStack_17800 = (fdb_kvs_handle *)0x11019b;
      fdb_doc_create((fdb_doc **)&pfStack_177d0,(void *)_Var31._M_i,sVar5 + 1,(void *)0x0,0,
                     (void *)0x0,0);
      pfStack_17800 = (fdb_kvs_handle *)0x1101aa;
      pcVar20 = (char *)auStack_177e8._8_8_;
      fVar3 = fdb_get((fdb_kvs_handle *)auStack_177e8._8_8_,(fdb_doc *)pfStack_177d0);
      pfVar19 = pfStack_177d0;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110806;
      pfVar16 = (fdb_kvs_handle *)(pfStack_177d0->field_6).seqtree;
      handle = *(fdb_kvs_handle **)
                (*(long *)(&afStack_172f8[0].kvs_config.create_if_missing + (long)pfVar11 * 8) +
                0x40);
      pfStack_17800 = (fdb_kvs_handle *)0x1101d6;
      iVar4 = bcmp(pfVar16,handle,(size_t)(pfStack_177d0->kvs_config).custom_cmp_param);
      if (iVar4 != 0) goto LAB_001107fb;
      pfStack_17800 = (fdb_kvs_handle *)0x1101e6;
      fdb_doc_free((fdb_doc *)pfVar19);
      pfVar11 = (fdb_kvs_handle *)&(pfVar11->kvs_config).field_0x1;
      pfVar8 = pfVar19;
    } while (pfVar11 != (fdb_kvs_handle *)0x2710);
    pfStack_17800 = (fdb_kvs_handle *)0x110200;
    fdb_close((fdb_file_handle *)auStack_177e8._0_8_);
    pcVar20 = (char *)&pfStack_177c0;
    pfStack_17800 = (fdb_kvs_handle *)0x110219;
    fVar3 = fdb_open((fdb_file_handle **)pcVar20,"compact_test_less",(fdb_config *)auStack_17758);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110847;
    pfStack_17800 = (fdb_kvs_handle *)0x110238;
    pcVar20 = (char *)pfStack_177c0;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)pfStack_177c0,(fdb_kvs_handle **)&pfStack_17778,
                       &fStack_177b0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011084c;
    auStack_17758._46_2_ = auStack_17758._46_2_ & 0xff;
    pcVar20 = (char *)&pfStack_177c8;
    pfStack_17800 = (fdb_kvs_handle *)0x11025d;
    fVar3 = fdb_open((fdb_file_handle **)pcVar20,"compact_test_non",(fdb_config *)auStack_17758);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110851;
    pfStack_17800 = (fdb_kvs_handle *)0x110279;
    pcVar20 = (char *)pfStack_177c8;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)pfStack_177c8,(fdb_kvs_handle **)&aStack_17780.seqtree,
                       &fStack_177b0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110856;
    auStack_17758._46_2_ = auStack_17758._46_2_ & 0xff00;
    pcVar20 = (char *)&pfStack_177d8;
    pfStack_17800 = (fdb_kvs_handle *)0x11029e;
    fVar3 = fdb_open((fdb_file_handle **)pcVar20,"compact_test_manual",(fdb_config *)auStack_17758);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011085b;
    pfStack_17800 = (fdb_kvs_handle *)0x1102ba;
    pcVar20 = (char *)pfStack_177d8;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)pfStack_177d8,(fdb_kvs_handle **)&aStack_17788.seqtree,
                       &fStack_177b0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110860;
    auStack_17758._46_2_ = 0x1e01;
    pcVar20 = auStack_177e8;
    pfStack_17800 = (fdb_kvs_handle *)0x1102e1;
    fVar3 = fdb_open((fdb_file_handle **)pcVar20,"compact_test",(fdb_config *)auStack_17758);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110865;
    pfStack_17800 = (fdb_kvs_handle *)0x1102fd;
    pcVar20 = (char *)auStack_177e8._0_8_;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_177e8._0_8_,(fdb_kvs_handle **)(auStack_177e8 + 8)
                       ,&fStack_177b0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011086a;
    pfStack_17800 = (fdb_kvs_handle *)0x11031d;
    pcVar20 = (char *)auStack_177e8._8_8_;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_177e8._8_8_,logCallbackFunc,
                       "compaction_daemon_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011086f;
    pcVar17 = (char *)0x0;
    pfStack_17800 = (fdb_kvs_handle *)0x11033a;
    printf("wait for %d seconds..\n");
    pfStack_17800 = (fdb_kvs_handle *)0x11034c;
    gettimeofday((timeval *)(auStack_17758 + 0xf8),(__timezone_ptr_t)0x0);
    tVar33.tv_usec = _Stack_17658._M_i;
    tVar33.tv_sec = auStack_17758._248_8_;
    do {
      pfVar19 = (fdb_kvs_handle *)0xfffffffffffec780;
      pfVar11 = (fdb_kvs_handle *)0x0;
      iVar4 = 0;
      aStack_17798 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar17;
      do {
        pfStack_17800 = (fdb_kvs_handle *)0x110388;
        fdb_set((fdb_kvs_handle *)auStack_177e8._8_8_,*(fdb_doc **)(acStack_3a78 + (long)pfVar19));
        pfStack_17800 = (fdb_kvs_handle *)0x110394;
        fdb_commit((fdb_file_handle *)auStack_177e8._0_8_,'\0');
        uVar23 = (int)((ulong)pfVar11 / 100) * 100 + iVar4;
        handle = (fdb_kvs_handle *)(ulong)uVar23;
        if (uVar23 == 0) {
          pfStack_17800 = (fdb_kvs_handle *)0x1103ae;
          fdb_set((fdb_kvs_handle *)pfStack_17778,*(fdb_doc **)(acStack_3a78 + (long)pfVar19));
          pfStack_17800 = (fdb_kvs_handle *)0x1103ba;
          fdb_commit((fdb_file_handle *)pfStack_177c0,'\0');
        }
        pfStack_17800 = (fdb_kvs_handle *)0x1103cc;
        fdb_set((fdb_kvs_handle *)aStack_17780.seqtree,*(fdb_doc **)(acStack_3a78 + (long)pfVar19));
        pfStack_17800 = (fdb_kvs_handle *)0x1103d8;
        fdb_commit((fdb_file_handle *)pfStack_177c8,'\0');
        pfStack_17800 = (fdb_kvs_handle *)0x1103ea;
        fdb_set((fdb_kvs_handle *)aStack_17788.seqtree,*(fdb_doc **)(acStack_3a78 + (long)pfVar19));
        pfStack_17800 = (fdb_kvs_handle *)0x1103f6;
        fdb_commit((fdb_file_handle *)pfStack_177d8,'\0');
        pfStack_17800 = (fdb_kvs_handle *)0x110405;
        gettimeofday((timeval *)&tStack_17768,(__timezone_ptr_t)0x0);
        pfStack_17800 = (fdb_kvs_handle *)0x110420;
        tVar32 = _utime_gap(tVar33,tStack_17768);
        if (pfStack_177b8 <= (fdb_kvs_handle *)tVar32.tv_sec) {
          pcVar17 = (char *)(anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x1;
          break;
        }
        iVar4 = iVar4 + -1;
        pfVar11 = (fdb_kvs_handle *)(ulong)((int)pfVar11 + 1);
        pfVar19 = (fdb_kvs_handle *)&(pfVar19->kvs_config).custom_cmp;
        pcVar17 = (char *)aStack_17798;
      } while (pfVar19 != (fdb_kvs_handle *)0x0);
    } while ((int)pcVar17 == 0);
    pfStack_17800 = (fdb_kvs_handle *)0x110459;
    pcVar20 = (char *)auStack_177e8._0_8_;
    fVar3 = fdb_set_daemon_compaction_interval((fdb_file_handle *)auStack_177e8._0_8_,0x3c);
    pfVar16 = (fdb_kvs_handle *)auStack_17758._248_8_;
    _Var31._M_i = _Stack_17658._M_i;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110874;
    pfStack_17800 = (fdb_kvs_handle *)0x110470;
    pcVar20 = (char *)auStack_177e8._0_8_;
    fVar3 = fdb_set_daemon_compaction_interval((fdb_file_handle *)auStack_177e8._0_8_,1);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110879;
    pfStack_17800 = (fdb_kvs_handle *)0x110484;
    pcVar20 = (char *)pfStack_177c8;
    fVar3 = fdb_compact((fdb_file_handle *)pfStack_177c8,(char *)0x0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011087e;
    pfStack_17800 = (fdb_kvs_handle *)0x11049d;
    pcVar20 = (char *)pfStack_177d8;
    fVar3 = fdb_compact((fdb_file_handle *)pfStack_177d8,"compact_test_manual_compacted");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110883;
    auStack_17758._46_2_ = auStack_17758._46_2_ & 0xff00;
    pcVar20 = (char *)&pfStack_17770;
    pfStack_17800 = (fdb_kvs_handle *)0x1104c5;
    fVar3 = fdb_open((fdb_file_handle **)pcVar20,"compact_test_manual_compacted",
                     (fdb_config *)auStack_17758);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110888;
    pfStack_17800 = (fdb_kvs_handle *)0x1104e1;
    pcVar20 = (char *)pfStack_177d8;
    fVar3 = fdb_switch_compaction_mode((fdb_file_handle *)pfStack_177d8,'\x01',0x1e);
    if (fVar3 != FDB_RESULT_FILE_IS_BUSY) goto LAB_0011088d;
    pfStack_17800 = (fdb_kvs_handle *)0x1104f7;
    fVar3 = fdb_close((fdb_file_handle *)pfStack_17770);
    pcVar20 = (char *)pfStack_17770;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110892;
    pfStack_17800 = (fdb_kvs_handle *)0x110513;
    pcVar20 = (char *)pfStack_177d8;
    fVar3 = fdb_switch_compaction_mode((fdb_file_handle *)pfStack_177d8,'\x01',10);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110897;
    pfStack_17800 = (fdb_kvs_handle *)0x11052f;
    pcVar20 = (char *)pfStack_177d8;
    fVar3 = fdb_switch_compaction_mode((fdb_file_handle *)pfStack_177d8,'\x01',0x1e);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011089c;
    pfStack_17800 = (fdb_kvs_handle *)0x110541;
    pcVar20 = (char *)pfStack_177d8;
    fVar3 = fdb_close((fdb_file_handle *)pfStack_177d8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108a1;
    auStack_17758[0x2e] = 1;
    pcVar20 = (char *)&pfStack_177d8;
    pfStack_17800 = (fdb_kvs_handle *)0x110566;
    fVar3 = fdb_open((fdb_file_handle **)pcVar20,"compact_test_manual_compacted",
                     (fdb_config *)auStack_17758);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108a6;
    pfStack_17800 = (fdb_kvs_handle *)0x11057c;
    pcVar20 = (char *)pfStack_177c8;
    fVar3 = fdb_switch_compaction_mode((fdb_file_handle *)pfStack_177c8,'\0',0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108ab;
    pfStack_17800 = (fdb_kvs_handle *)0x11058e;
    pcVar20 = (char *)pfStack_177c8;
    fVar3 = fdb_close((fdb_file_handle *)pfStack_177c8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108b0;
    auStack_17758._46_2_ = auStack_17758._46_2_ & 0xff00;
    pcVar20 = (char *)&pfStack_177c8;
    pfStack_17800 = (fdb_kvs_handle *)0x1105b3;
    fVar3 = fdb_open((fdb_file_handle **)pcVar20,"compact_test_non",(fdb_config *)auStack_17758);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108b5;
    pcVar17 = "compact_test_non.manual";
    pfStack_17800 = (fdb_kvs_handle *)0x1105cf;
    fdb_compact((fdb_file_handle *)pfStack_177c8,"compact_test_non.manual");
    pfVar16 = (fdb_kvs_handle *)auStack_177e8;
    pfStack_17800 = (fdb_kvs_handle *)0x1105dc;
    fdb_close((fdb_file_handle *)auStack_177e8._0_8_);
    pfStack_17800 = (fdb_kvs_handle *)0x1105e6;
    fdb_close((fdb_file_handle *)pfStack_177c0);
    pfStack_17800 = (fdb_kvs_handle *)0x1105f0;
    fdb_close((fdb_file_handle *)pfStack_177d8);
    auStack_17758[0x2e] = 1;
    pfStack_17800 = (fdb_kvs_handle *)0x110607;
    pcVar20 = (char *)pfVar16;
    fVar3 = fdb_open((fdb_file_handle **)pfVar16,"compact_test_non.manual",
                     (fdb_config *)auStack_17758);
    if (fVar3 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_001108ba;
    pcVar20 = "compact_test_non.manual";
    pfStack_17800 = (fdb_kvs_handle *)0x110624;
    fVar3 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_17758);
    if (fVar3 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_001108bf;
    auStack_17758._46_2_ = auStack_17758._46_2_ & 0xff00;
    pcVar20 = auStack_177e8;
    pfStack_17800 = (fdb_kvs_handle *)0x11064a;
    fVar3 = fdb_open((fdb_file_handle **)pcVar20,"compact_test_manual_compacted",
                     (fdb_config *)auStack_17758);
    if (fVar3 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_001108c4;
    pcVar20 = "compact_test_manual_compacted";
    pfStack_17800 = (fdb_kvs_handle *)0x110667;
    fVar3 = fdb_destroy("compact_test_manual_compacted",(fdb_config *)auStack_17758);
    if (fVar3 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_001108c9;
    auStack_17758[0x2e] = 1;
    pcVar20 = "compact_test_manual_compacted";
    pfStack_17800 = (fdb_kvs_handle *)0x110688;
    fVar3 = fdb_destroy("compact_test_manual_compacted",(fdb_config *)auStack_17758);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108ce;
    auStack_17758._46_2_ = auStack_17758._46_2_ & 0xff00;
    pcVar20 = "compact_test_non.manual";
    pfStack_17800 = (fdb_kvs_handle *)0x1106a8;
    fVar3 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_17758);
    if (fVar3 != FDB_RESULT_FILE_IS_BUSY) goto LAB_001108d3;
    pfStack_17800 = (fdb_kvs_handle *)0x1106bb;
    fdb_close((fdb_file_handle *)pfStack_177c8);
    pfStack_17800 = (fdb_kvs_handle *)0x1106c0;
    fVar3 = fdb_shutdown();
    pcVar20 = (char *)pfStack_177c8;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108d8;
    pcVar20 = "compact_test_non.manual";
    pfStack_17800 = (fdb_kvs_handle *)0x1106dc;
    fVar3 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_17758);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108dd;
    auStack_17758._36_4_ = 2;
    pcVar20 = auStack_177e8;
    pfStack_17800 = (fdb_kvs_handle *)0x110704;
    fVar3 = fdb_open((fdb_file_handle **)pcVar20,"./compact_test_manual_compacted",
                     (fdb_config *)auStack_17758);
    if (fVar3 != FDB_RESULT_NO_SUCH_FILE) goto LAB_001108e2;
    pcVar20 = auStack_177e8;
    pfStack_17800 = (fdb_kvs_handle *)0x110726;
    fVar3 = fdb_open((fdb_file_handle **)pcVar20,"./compact_test_manual_compacted.meta",
                     (fdb_config *)auStack_17758);
    if (fVar3 != FDB_RESULT_NO_SUCH_FILE) goto LAB_001108e7;
    pcVar20 = auStack_177e8;
    pfStack_17800 = (fdb_kvs_handle *)0x110748;
    fVar3 = fdb_open((fdb_file_handle **)pcVar20,"compact_test_non",(fdb_config *)auStack_17758);
    if (fVar3 != FDB_RESULT_NO_SUCH_FILE) goto LAB_001108ec;
    pcVar20 = auStack_177e8;
    pfStack_17800 = (fdb_kvs_handle *)0x11076a;
    fVar3 = fdb_open((fdb_file_handle **)pcVar20,"compact_test_non.manual",
                     (fdb_config *)auStack_17758);
    if (fVar3 == FDB_RESULT_NO_SUCH_FILE) {
      lVar24 = 0;
      do {
        pfStack_17800 = (fdb_kvs_handle *)0x110782;
        fdb_doc_free(*(fdb_doc **)(&afStack_172f8[0].kvs_config.create_if_missing + lVar24 * 8));
        lVar24 = lVar24 + 1;
      } while (lVar24 != 10000);
      pfStack_17800 = (fdb_kvs_handle *)0x110793;
      fdb_shutdown();
      pfStack_17800 = (fdb_kvs_handle *)0x110798;
      memleak_end();
      pcVar20 = "%s PASSED\n";
      if (compaction_daemon_test(unsigned_long)::__test_pass != '\0') {
        pcVar20 = "%s FAILED\n";
      }
      pfStack_17800 = (fdb_kvs_handle *)0x1107c9;
      fprintf(_stderr,pcVar20,"compaction daemon test");
      return;
    }
  }
  else {
LAB_0011080b:
    pfStack_17800 = (fdb_kvs_handle *)0x110810;
    compaction_daemon_test();
LAB_00110810:
    pfStack_17800 = (fdb_kvs_handle *)0x110815;
    compaction_daemon_test();
LAB_00110815:
    pfStack_17800 = (fdb_kvs_handle *)0x11081a;
    compaction_daemon_test();
LAB_0011081a:
    pfStack_17800 = (fdb_kvs_handle *)0x11081f;
    compaction_daemon_test();
LAB_0011081f:
    pfStack_17800 = (fdb_kvs_handle *)0x110824;
    compaction_daemon_test();
LAB_00110824:
    pfStack_17800 = (fdb_kvs_handle *)0x110829;
    compaction_daemon_test();
LAB_00110829:
    pfStack_17800 = (fdb_kvs_handle *)0x11082e;
    compaction_daemon_test();
LAB_0011082e:
    pfStack_17800 = (fdb_kvs_handle *)0x110833;
    compaction_daemon_test();
    pfVar19 = pfVar8;
LAB_00110833:
    pfStack_17800 = (fdb_kvs_handle *)0x110838;
    compaction_daemon_test();
LAB_00110838:
    pfStack_17800 = (fdb_kvs_handle *)0x11083d;
    compaction_daemon_test();
LAB_0011083d:
    pfStack_17800 = (fdb_kvs_handle *)0x110842;
    compaction_daemon_test();
LAB_00110842:
    pfStack_17800 = (fdb_kvs_handle *)0x110847;
    compaction_daemon_test();
LAB_00110847:
    pfStack_17800 = (fdb_kvs_handle *)0x11084c;
    compaction_daemon_test();
LAB_0011084c:
    pfStack_17800 = (fdb_kvs_handle *)0x110851;
    compaction_daemon_test();
LAB_00110851:
    pfStack_17800 = (fdb_kvs_handle *)0x110856;
    compaction_daemon_test();
LAB_00110856:
    pfStack_17800 = (fdb_kvs_handle *)0x11085b;
    compaction_daemon_test();
LAB_0011085b:
    pfStack_17800 = (fdb_kvs_handle *)0x110860;
    compaction_daemon_test();
LAB_00110860:
    pfStack_17800 = (fdb_kvs_handle *)0x110865;
    compaction_daemon_test();
LAB_00110865:
    pfStack_17800 = (fdb_kvs_handle *)0x11086a;
    compaction_daemon_test();
LAB_0011086a:
    pfStack_17800 = (fdb_kvs_handle *)0x11086f;
    compaction_daemon_test();
LAB_0011086f:
    pfStack_17800 = (fdb_kvs_handle *)0x110874;
    compaction_daemon_test();
LAB_00110874:
    pfStack_17800 = (fdb_kvs_handle *)0x110879;
    compaction_daemon_test();
LAB_00110879:
    pfStack_17800 = (fdb_kvs_handle *)0x11087e;
    compaction_daemon_test();
LAB_0011087e:
    pfStack_17800 = (fdb_kvs_handle *)0x110883;
    compaction_daemon_test();
LAB_00110883:
    pfStack_17800 = (fdb_kvs_handle *)0x110888;
    compaction_daemon_test();
LAB_00110888:
    pfStack_17800 = (fdb_kvs_handle *)0x11088d;
    compaction_daemon_test();
LAB_0011088d:
    pfStack_17800 = (fdb_kvs_handle *)0x110892;
    compaction_daemon_test();
LAB_00110892:
    pfStack_17800 = (fdb_kvs_handle *)0x110897;
    compaction_daemon_test();
LAB_00110897:
    pfStack_17800 = (fdb_kvs_handle *)0x11089c;
    compaction_daemon_test();
LAB_0011089c:
    pfStack_17800 = (fdb_kvs_handle *)0x1108a1;
    compaction_daemon_test();
LAB_001108a1:
    pfStack_17800 = (fdb_kvs_handle *)0x1108a6;
    compaction_daemon_test();
LAB_001108a6:
    pfStack_17800 = (fdb_kvs_handle *)0x1108ab;
    compaction_daemon_test();
LAB_001108ab:
    pfStack_17800 = (fdb_kvs_handle *)0x1108b0;
    compaction_daemon_test();
LAB_001108b0:
    pfStack_17800 = (fdb_kvs_handle *)0x1108b5;
    compaction_daemon_test();
LAB_001108b5:
    pfStack_17800 = (fdb_kvs_handle *)0x1108ba;
    compaction_daemon_test();
LAB_001108ba:
    pfStack_17800 = (fdb_kvs_handle *)0x1108bf;
    compaction_daemon_test();
LAB_001108bf:
    pfStack_17800 = (fdb_kvs_handle *)0x1108c4;
    compaction_daemon_test();
LAB_001108c4:
    pfStack_17800 = (fdb_kvs_handle *)0x1108c9;
    compaction_daemon_test();
LAB_001108c9:
    pfStack_17800 = (fdb_kvs_handle *)0x1108ce;
    compaction_daemon_test();
LAB_001108ce:
    pfStack_17800 = (fdb_kvs_handle *)0x1108d3;
    compaction_daemon_test();
LAB_001108d3:
    pfStack_17800 = (fdb_kvs_handle *)0x1108d8;
    compaction_daemon_test();
LAB_001108d8:
    pfStack_17800 = (fdb_kvs_handle *)0x1108dd;
    compaction_daemon_test();
LAB_001108dd:
    pfStack_17800 = (fdb_kvs_handle *)0x1108e2;
    compaction_daemon_test();
LAB_001108e2:
    pfStack_17800 = (fdb_kvs_handle *)0x1108e7;
    compaction_daemon_test();
LAB_001108e7:
    pfStack_17800 = (fdb_kvs_handle *)0x1108ec;
    compaction_daemon_test();
LAB_001108ec:
    pfStack_17800 = (fdb_kvs_handle *)0x1108f1;
    compaction_daemon_test();
  }
  pfStack_17800 = (fdb_kvs_handle *)auto_compaction_with_concurrent_insert_test;
  compaction_daemon_test();
  pfStack_17998 = (fdb_kvs_handle *)0x110916;
  aStack_17828 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar17;
  pfStack_17820 = handle;
  pfStack_17818 = pfVar11;
  pfStack_17810 = pfVar16;
  ppfStack_17808 = (fdb_doc **)_Var31._M_i;
  pfStack_17800 = pfVar19;
  gettimeofday(&tStack_17948,(__timezone_ptr_t)0x0);
  pfStack_17998 = (fdb_kvs_handle *)0x11091b;
  memleak_start();
  pfStack_17998 = (fdb_kvs_handle *)0x110927;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_17998 = (fdb_kvs_handle *)0x110934;
  fdb_get_default_config();
  uStack_178f2 = 1;
  uStack_178e8._0_2_ = 1;
  uStack_178e8._2_2_ = 0;
  uStack_178e8._4_4_ = 0;
  pfStack_17998 = (fdb_kvs_handle *)0x110955;
  fVar3 = fdb_open(&pfStack_17988,"compact_test",(fdb_config *)(auStack_17938 + 0x18));
  pfVar27 = (fdb_config *)(auStack_17938 + 0x18);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pfVar27 = (fdb_config *)auStack_17938;
    pfStack_17998 = (fdb_kvs_handle *)0x11096a;
    fdb_get_default_kvs_config();
    pfStack_17998 = (fdb_kvs_handle *)0x11097c;
    fVar3 = fdb_kvs_open_default(pfStack_17988,&pfStack_17980,(fdb_kvs_config *)pfVar27);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110aad;
    pfStack_17998 = (fdb_kvs_handle *)0x110993;
    gettimeofday(&tStack_17958,(__timezone_ptr_t)0x0);
    pfStack_17998 = (fdb_kvs_handle *)0x1109a3;
    printf("wait for %d seconds..\n",(ulong)pcVar20 & 0xffffffff);
    tVar32.tv_usec = tStack_17958.tv_usec;
    tVar32.tv_sec = tStack_17958.tv_sec;
    pfVar11 = (fdb_kvs_handle *)((long)&atStack_17978[1].tv_sec + 1);
    pfVar19 = (fdb_kvs_handle *)0x0;
    do {
      iVar4 = (int)pfVar19;
      pfStack_17998 = (fdb_kvs_handle *)0x1109c4;
      sprintf((char *)pfVar11,"%d",pfVar19);
      handle = pfStack_17980;
      pfStack_17998 = (fdb_kvs_handle *)0x1109d1;
      sVar5 = strlen((char *)pfVar11);
      pfStack_17998 = (fdb_kvs_handle *)0x1109ec;
      fVar3 = fdb_set_kv(handle,pfVar11,sVar5,"value",5);
      pfVar27 = (fdb_config *)tStack_17958.tv_sec;
      _Var31._M_i = tStack_17958.tv_usec;
      if (fVar3 != FDB_RESULT_SUCCESS) {
LAB_00110aa3:
        pfStack_17998 = (fdb_kvs_handle *)0x110aa8;
        auto_compaction_with_concurrent_insert_test();
        goto LAB_00110aa8;
      }
      pfStack_17998 = (fdb_kvs_handle *)0x110a00;
      fVar3 = fdb_commit(pfStack_17988,'\0');
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_17998 = (fdb_kvs_handle *)0x110aa3;
        auto_compaction_with_concurrent_insert_test();
        goto LAB_00110aa3;
      }
      pfStack_17998 = (fdb_kvs_handle *)0x110a14;
      gettimeofday((timeval *)atStack_17978,(__timezone_ptr_t)0x0);
      pfStack_17998 = (fdb_kvs_handle *)0x110a29;
      tVar33 = _utime_gap(tVar32,atStack_17978[0]);
    } while (((fdb_kvs_handle *)tVar33.tv_sec < pcVar20) &&
            (pfVar19 = (fdb_kvs_handle *)(ulong)(iVar4 + 1), iVar4 != 99999));
    pfStack_17998 = (fdb_kvs_handle *)0x110a49;
    fVar3 = fdb_close(pfStack_17988);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110ab2;
    pfStack_17998 = (fdb_kvs_handle *)0x110a52;
    fVar3 = fdb_shutdown();
    if (fVar3 == FDB_RESULT_SUCCESS) {
      pfStack_17998 = (fdb_kvs_handle *)0x110a5b;
      memleak_end();
      pcVar20 = "%s PASSED\n";
      if (auto_compaction_with_concurrent_insert_test(unsigned_long)::__test_pass != '\0') {
        pcVar20 = "%s FAILED\n";
      }
      pfStack_17998 = (fdb_kvs_handle *)0x110a8c;
      fprintf(_stderr,pcVar20,"auto compaction with concurrent insert test");
      return;
    }
  }
  else {
LAB_00110aa8:
    pfStack_17998 = (fdb_kvs_handle *)0x110aad;
    auto_compaction_with_concurrent_insert_test();
LAB_00110aad:
    pfStack_17998 = (fdb_kvs_handle *)0x110ab2;
    auto_compaction_with_concurrent_insert_test();
LAB_00110ab2:
    pfStack_17998 = (fdb_kvs_handle *)0x110ab7;
    auto_compaction_with_concurrent_insert_test();
  }
  pfStack_17998 = (fdb_kvs_handle *)auto_compaction_with_custom_cmp_function;
  auto_compaction_with_concurrent_insert_test();
  pfStack_179c0 = (fdb_kvs_handle *)pcVar20;
  pfStack_179b8 = handle;
  pfStack_179b0 = pfVar11;
  pfStack_179a8 = pfVar27;
  ppfStack_179a0 = (fdb_doc **)_Var31._M_i;
  pfStack_17998 = pfVar19;
  gettimeofday(&tStack_17cc8,(__timezone_ptr_t)0x0);
  memleak_start();
  auStack_17d38._32_8_ = (btree *)0x0;
  auStack_17d38._24_8_ = _compact_test_keycmp;
  system("rm -rf  compact_test* > errorlog.txt");
  fdb_get_default_config();
  fStack_17ab8.wal_threshold = 0x1000;
  fStack_17ab8.compaction_mode = '\x01';
  fStack_17ab8.compaction_threshold = '\n';
  fStack_17ab8.compactor_sleep_duration = 1;
  info_00 = (fdb_file_info *)0x14e0c5;
  pfVar8 = (fdb_kvs_handle *)&pfStack_17d58;
  kvs_config_00 = (fdb_file_info *)0x1;
  fVar3 = fdb_open_custom_cmp((fdb_file_handle **)pfVar8,"compact_test",&fStack_17ab8,1,
                              (char **)(auStack_17d38 + 0x20),
                              (fdb_custom_cmp_variable *)(auStack_17d38 + 0x18),(void **)0x0);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    fdb_get_default_kvs_config();
    auStack_17d38._16_8_ = afStack_17cb8[0].doc_count;
    auStack_17d38._0_8_ = afStack_17cb8[0].filename;
    auStack_17d38._8_8_ = afStack_17cb8[0].new_filename;
    info_00 = (fdb_file_info *)auStack_17d50;
    pfVar8 = pfStack_17d58;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)pfStack_17d58,(fdb_kvs_handle **)info_00,
                       (fdb_kvs_config *)auStack_17d38);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110eb4;
    info_00 = (fdb_file_info *)auStack_17d40;
    kvs_config_00 = (fdb_file_info *)auStack_17d38;
    pfVar8 = pfStack_17d58;
    fVar3 = fdb_kvs_open((fdb_file_handle *)pfStack_17d58,(fdb_kvs_handle **)info_00,"db",
                         (fdb_kvs_config *)kvs_config_00);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110eb9;
    uVar12 = 0;
    do {
      sprintf((char *)afStack_17cb8,"key%06d",uVar12);
      sprintf((char *)afStack_17bb8,"body%06d",uVar12);
      pfVar8 = (fdb_kvs_handle *)auStack_17d50._0_8_;
      sVar5 = strlen((char *)afStack_17cb8);
      sVar6 = strlen((char *)afStack_17bb8);
      kvs_config_00 = afStack_17bb8;
      info_00 = afStack_17cb8;
      fVar3 = fdb_set_kv(pfVar8,afStack_17cb8,sVar5,afStack_17bb8,sVar6);
      handle_00 = auStack_17d40;
      if (fVar3 != FDB_RESULT_SUCCESS) {
LAB_00110e9b:
        auto_compaction_with_custom_cmp_function();
        goto LAB_00110ea0;
      }
      sVar5 = strlen((char *)afStack_17cb8);
      sVar6 = strlen((char *)afStack_17bb8);
      kvs_config_00 = afStack_17bb8;
      info_00 = afStack_17cb8;
      fVar3 = fdb_set_kv((fdb_kvs_handle *)handle_00,afStack_17cb8,sVar5,afStack_17bb8,sVar6);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        auto_compaction_with_custom_cmp_function();
        pfVar8 = (fdb_kvs_handle *)handle_00;
        goto LAB_00110e9b;
      }
      uVar23 = (int)uVar12 + 1;
      uVar12 = (ulong)uVar23;
    } while (uVar23 != 10000);
    kvs_config_00 = (fdb_file_info *)auStack_17d38;
    auStack_17d38._8_8_ = _compact_test_keycmp;
    info_00 = (fdb_file_info *)(auStack_17d50 + 8);
    pfVar8 = pfStack_17d58;
    fVar3 = fdb_kvs_open((fdb_file_handle *)pfStack_17d58,(fdb_kvs_handle **)info_00,"db_custom",
                         (fdb_kvs_config *)kvs_config_00);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110ebe;
    info_00 = afStack_17cb8;
    sprintf((char *)info_00,"key%06d",0);
    kvs_config_00 = afStack_17bb8;
    sprintf((char *)kvs_config_00,"body%06d",0);
    sVar5 = strlen((char *)info_00);
    sVar6 = strlen((char *)kvs_config_00);
    fVar3 = fdb_set_kv((fdb_kvs_handle *)auStack_17d50._8_8_,info_00,sVar5,kvs_config_00,sVar6);
    pfVar8 = (fdb_kvs_handle *)auStack_17d50._8_8_;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110ec3;
    info_00 = (fdb_file_info *)0x0;
    pfVar8 = pfStack_17d58;
    fVar3 = fdb_commit((fdb_file_handle *)pfStack_17d58,'\0');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110ec8;
    uVar12 = 0;
    uVar28 = 0;
    do {
      sprintf((char *)afStack_17cb8,"key%06d",uVar28);
      sprintf((char *)afStack_17bb8,"body%06d",uVar28);
      pfVar8 = (fdb_kvs_handle *)auStack_17d50._0_8_;
      sVar5 = strlen((char *)afStack_17cb8);
      sVar6 = strlen((char *)afStack_17bb8);
      kvs_config_00 = afStack_17bb8;
      info_00 = afStack_17cb8;
      fVar3 = fdb_set_kv(pfVar8,afStack_17cb8,sVar5,afStack_17bb8,sVar6);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110ea5;
      info_00 = (fdb_file_info *)(auStack_17d38 + 0x28);
      pfVar8 = pfStack_17d58;
      fVar3 = fdb_get_file_info((fdb_file_handle *)pfStack_17d58,info_00);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110ea0;
      if (uVar12 < uStack_17ce8) {
        uVar12 = uStack_17ce8;
      }
      uVar23 = (int)uVar28 + 1;
      uVar28 = (ulong)uVar23;
    } while (uVar23 != 10000);
    info_00 = (fdb_file_info *)0x0;
    pfVar8 = pfStack_17d58;
    fVar3 = fdb_commit((fdb_file_handle *)pfStack_17d58,'\0');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110ecd;
    info_00 = (fdb_file_info *)(auStack_17d38 + 0x28);
    pfVar8 = pfStack_17d58;
    fVar3 = fdb_get_file_info((fdb_file_handle *)pfStack_17d58,info_00);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110ed2;
    if (uVar12 < uStack_17ce8) {
      uVar12 = uStack_17ce8;
    }
    printf("wait for daemon compaction completion... (max file size: %lu)\n",uVar12);
    do {
      sleep(1);
      info_00 = (fdb_file_info *)(auStack_17d38 + 0x28);
      pfVar8 = pfStack_17d58;
      fVar3 = fdb_get_file_info((fdb_file_handle *)pfStack_17d58,
                                (fdb_file_info *)(auStack_17d38 + 0x28));
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110eaa;
    } while (uVar12 <= uStack_17ce8);
    fVar3 = fdb_close((fdb_file_handle *)pfStack_17d58);
    pfVar8 = pfStack_17d58;
    if (fVar3 == FDB_RESULT_SUCCESS) {
      fVar3 = fdb_shutdown();
      pfVar8 = pfStack_17d58;
      if (fVar3 == FDB_RESULT_SUCCESS) {
        memleak_end();
        pcVar20 = "%s PASSED\n";
        if (auto_compaction_with_custom_cmp_function()::__test_pass != '\0') {
          pcVar20 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar20,"auto compaction with custom comparison function");
        return;
      }
      goto LAB_00110edc;
    }
  }
  else {
LAB_00110eaf:
    auto_compaction_with_custom_cmp_function();
LAB_00110eb4:
    auto_compaction_with_custom_cmp_function();
LAB_00110eb9:
    auto_compaction_with_custom_cmp_function();
LAB_00110ebe:
    auto_compaction_with_custom_cmp_function();
LAB_00110ec3:
    auto_compaction_with_custom_cmp_function();
LAB_00110ec8:
    auto_compaction_with_custom_cmp_function();
LAB_00110ecd:
    auto_compaction_with_custom_cmp_function();
LAB_00110ed2:
    auto_compaction_with_custom_cmp_function();
  }
  auto_compaction_with_custom_cmp_function();
LAB_00110edc:
  auto_compaction_with_custom_cmp_function();
  if (info_00 == kvs_config_00) {
    memcmp(pfVar8,__s2,(size_t)info_00);
    return;
  }
  if (info_00 < kvs_config_00) {
    kvs_config_00 = info_00;
  }
  memcmp(pfVar8,__s2,(size_t)kvs_config_00);
  return;
LAB_0010eacf:
  pfStack_2078 = (fdb_kvs_handle *)0x10ead4;
  compact_upto_test();
LAB_0010ead4:
  pfStack_2078 = (fdb_kvs_handle *)0x10ead9;
  compact_upto_test();
LAB_0010ead9:
  pfStack_2078 = (fdb_kvs_handle *)0x10eade;
  compact_upto_test();
LAB_0010eade:
  pfStack_2078 = (fdb_kvs_handle *)0x10eae3;
  compact_upto_test();
LAB_0010eae3:
  pfStack_2078 = (fdb_kvs_handle *)0x10eae8;
  compact_upto_test();
  goto LAB_0010eae8;
LAB_001107eb:
  pfStack_17800 = (fdb_kvs_handle *)0x1107f6;
  compaction_daemon_test();
  pfVar8 = pfVar19;
LAB_001107f6:
  pfVar19 = pfVar8;
  pfStack_17800 = (fdb_kvs_handle *)0x1107fb;
  compaction_daemon_test();
LAB_001107fb:
  pfStack_17800 = (fdb_kvs_handle *)0x110806;
  pcVar20 = (char *)handle;
  compaction_daemon_test();
  pfVar8 = pfVar19;
LAB_00110806:
  _Var31._M_i = (__int_type_conflict)apfStack_175f8;
  pcVar17 = "key%04d";
  pfStack_17800 = (fdb_kvs_handle *)0x11080b;
  compaction_daemon_test();
  goto LAB_0011080b;
LAB_00110ea0:
  auto_compaction_with_custom_cmp_function();
LAB_00110ea5:
  auto_compaction_with_custom_cmp_function();
LAB_00110eaa:
  auto_compaction_with_custom_cmp_function();
  goto LAB_00110eaf;
}

Assistant:

void compact_reopen_named_kvs()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 100;
    int nkvdocs;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_status status;
    fdb_kvs_info kvs_info;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous compact_test files
    r = system(SHELL_DEL" compact_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;

    // open db
    fdb_open(&dbfile, "./compact_test1", &fconfig);
    fdb_kvs_open(dbfile, &db, "db",  &kvs_config);

    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "compact_reopen_named_kvs");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // compact
    fdb_compact(dbfile, NULL);

    // save ndocs
    fdb_get_kvs_info(db, &kvs_info);
    nkvdocs = kvs_info.doc_count;

    // close db file
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // reopen
    fdb_open(&dbfile, "./compact_test1", &fconfig);
    fdb_kvs_open(dbfile, &db, "db",  &kvs_config);

    // verify kvs stats
    fdb_get_kvs_info(db, &kvs_info);
    TEST_CHK((uint64_t)nkvdocs == kvs_info.doc_count);

    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("compact reopen named kvs");
}